

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render-data.cc
# Opt level: O2

bool tinyusdz::tydra::anon_unknown_0::TryConvertFacevaryingToVertex
               (VertexAttribute *src,VertexAttribute *dst,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *faceVertexIndices,string *err,
               float eps)

{
  float (*pafVar1) [2];
  undefined8 *puVar2;
  size_type *psVar3;
  double adVar4 [2];
  float afVar5 [4];
  mapped_type mVar6;
  mapped_type mVar7;
  mapped_type mVar8;
  uint uVar9;
  mapped_type mVar10;
  undefined4 uVar11;
  pointer puVar12;
  float afVar13 [2];
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined4 *puVar22;
  size_type sVar23;
  size_type sVar24;
  bool bVar25;
  size_t sVar26;
  size_t sVar27;
  ostream *poVar28;
  size_type sVar29;
  mapped_type *pmVar30;
  size_type sVar31;
  mapped_type *pmVar32;
  size_type sVar33;
  size_type sVar34;
  mapped_type *pmVar35;
  size_type sVar36;
  mapped_type *pmVar37;
  size_type sVar38;
  mapped_type *pmVar39;
  size_type sVar40;
  mapped_type *pmVar41;
  size_type sVar42;
  mapped_type *pmVar43;
  size_type sVar44;
  mapped_type *pmVar45;
  size_type sVar46;
  mapped_type *pmVar47;
  size_type sVar48;
  mapped_type *pmVar49;
  size_type sVar50;
  mapped_type *pmVar51;
  size_type sVar52;
  mapped_type *pmVar53;
  size_type sVar54;
  mapped_type *pmVar55;
  size_type sVar56;
  mapped_type *pmVar57;
  size_type sVar58;
  mapped_type *pmVar59;
  size_type sVar60;
  mapped_type *pmVar61;
  size_type sVar62;
  mapped_type *pmVar63;
  size_type sVar64;
  mapped_type *pmVar65;
  size_type sVar66;
  mapped_type *pmVar67;
  size_type sVar68;
  mapped_type *pmVar69;
  size_type sVar70;
  mapped_type *pmVar71;
  size_type sVar72;
  mapped_type *pmVar73;
  size_type sVar74;
  mapped_type *pmVar75;
  size_type sVar76;
  mapped_type *pmVar77;
  size_type sVar78;
  mapped_type *pmVar79;
  size_type sVar80;
  mapped_type *pmVar81;
  pointer puVar82;
  size_type sVar83;
  mapped_type *pmVar84;
  size_type sVar85;
  mapped_type *pmVar86;
  uint *puVar87;
  ulong uVar88;
  long lVar89;
  ulong uVar90;
  VertexAttributeFormat f;
  pointer puVar91;
  pointer *ppaVar92;
  uint uVar93;
  char *pcVar94;
  ulong uVar95;
  double *pdVar96;
  pointer paVar97;
  undefined8 *puVar98;
  float fVar99;
  long lVar100;
  ulong uVar101;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar102;
  byte bVar103;
  double dVar104;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  int iVar107;
  int iVar108;
  float fVar109;
  long local_248;
  vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_> vdst;
  uint32_t vidx;
  float fStack_214;
  float afStack_210 [2];
  pointer local_208;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_200;
  undefined1 local_1f8 [16];
  vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_> vsrc;
  array<unsigned_int,_2UL> aaStack_1b8 [2];
  ostringstream ss_e;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_198;
  _Prime_rehash_policy _Stack_188;
  undefined4 uStack_178;
  undefined4 uStack_174;
  undefined4 uStack_170;
  undefined4 uStack_16c;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 local_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 local_130;
  
  bVar103 = 0;
  if (dst == (VertexAttribute *)0x0) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
    poVar28 = ::std::operator<<((ostream *)&ss_e,"[error]");
    poVar28 = ::std::operator<<(poVar28,
                                "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                               );
    poVar28 = ::std::operator<<(poVar28,":");
    poVar28 = ::std::operator<<(poVar28,"TryConvertFacevaryingToVertex");
    poVar28 = ::std::operator<<(poVar28,"():");
    poVar28 = (ostream *)::std::ostream::operator<<(poVar28,0x2b4);
    ::std::operator<<(poVar28," ");
    pcVar94 = "Output `dst` is nullptr.";
LAB_002933d3:
    poVar28 = ::std::operator<<((ostream *)&ss_e,pcVar94);
LAB_002933db:
    ::std::operator<<(poVar28,"\n");
    if (err != (string *)0x0) {
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::string::append((string *)err);
      ::std::__cxx11::string::_M_dispose();
    }
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
LAB_00293424:
    bVar25 = false;
  }
  else {
    if (src->variability != FaceVarying) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
      poVar28 = ::std::operator<<((ostream *)&ss_e,"[error]");
      poVar28 = ::std::operator<<(poVar28,
                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                 );
      poVar28 = ::std::operator<<(poVar28,":");
      poVar28 = ::std::operator<<(poVar28,"TryConvertFacevaryingToVertex");
      poVar28 = ::std::operator<<(poVar28,"():");
      poVar28 = (ostream *)::std::ostream::operator<<(poVar28,0x2b8);
      ::std::operator<<(poVar28," ");
      pcVar94 = "Input must be \'facevarying\' attribute";
      goto LAB_002933d3;
    }
    if (src->elementSize != 1) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
      poVar28 = ::std::operator<<((ostream *)&ss_e,"[error]");
      poVar28 = ::std::operator<<(poVar28,
                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                 );
      poVar28 = ::std::operator<<(poVar28,":");
      poVar28 = ::std::operator<<(poVar28,"TryConvertFacevaryingToVertex");
      poVar28 = ::std::operator<<(poVar28,"():");
      poVar28 = (ostream *)::std::ostream::operator<<(poVar28,700);
      ::std::operator<<(poVar28," ");
      pcVar94 = "Input\'s element_size must be 1.";
      goto LAB_002933d3;
    }
    if (src->stride != 0) {
      sVar26 = VertexAttribute::stride_bytes(src);
      sVar27 = VertexAttribute::format_size(src);
      if (sVar26 == sVar27) goto LAB_00293159;
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
      poVar28 = ::std::operator<<((ostream *)&ss_e,"[error]");
      poVar28 = ::std::operator<<(poVar28,
                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                 );
      poVar28 = ::std::operator<<(poVar28,":");
      poVar28 = ::std::operator<<(poVar28,"TryConvertFacevaryingToVertex");
      poVar28 = ::std::operator<<(poVar28,"():");
      poVar28 = (ostream *)::std::ostream::operator<<(poVar28,0x2c2);
      ::std::operator<<(poVar28," ");
      poVar28 = ::std::operator<<((ostream *)&ss_e,
                                  "Input attribute must be tightly packed. stride_bytes = ");
      VertexAttribute::stride_bytes(src);
      poVar28 = ::std::ostream::_M_insert<unsigned_long>((ulong)poVar28);
      poVar28 = ::std::operator<<(poVar28,", format_size = ");
      VertexAttribute::format_size(src);
      poVar28 = ::std::ostream::_M_insert<unsigned_long>((ulong)poVar28);
      goto LAB_002933db;
    }
LAB_00293159:
    puVar87 = &switchD_00293179::switchdataD_0048c9a8;
    local_200 = faceVertexIndices;
    switch(src->format) {
    case Bool:
    case Byte:
      _ss_e = 0;
      aStack_198._M_allocated_capacity._0_4_ = 0;
      aStack_198._M_allocated_capacity._4_4_ = 0;
      sVar26 = VertexAttribute::vertex_count(src);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ss_e,sVar26);
      puVar12 = (src->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start;
      memcpy((void *)(ulong)_ss_e,puVar12,
             (long)(src->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish - (long)puVar12);
      vsrc.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      vsrc.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      vsrc.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar25 = TryConvertFacevaryingToVertexInt<unsigned_char>
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ss_e,
                          (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&vsrc,
                          faceVertexIndices);
      if (bVar25) {
        ::std::__cxx11::string::_M_assign((string *)dst);
        dst->elementSize = 1;
        dst->format = src->format;
        dst->variability = Vertex;
        lVar100 = (long)vsrc.
                        super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)vsrc.
                        super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
        sVar26 = VertexAttribute::format_size(src);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data,
                   lVar100 * sVar26);
        puVar12 = (dst->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        memcpy(puVar12,vsrc.
                       super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
               (long)(dst->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish - (long)puVar12);
      }
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&vsrc);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&ss_e);
      break;
    case Char:
      vsrc.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      vsrc.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      vsrc.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      sVar26 = VertexAttribute::vertex_count(src);
      ::std::vector<signed_char,_std::allocator<signed_char>_>::resize
                ((vector<signed_char,_std::allocator<signed_char>_> *)&vsrc,sVar26);
      puVar12 = (src->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start;
      memcpy(vsrc.
             super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start,puVar12,
             (long)(src->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish - (long)puVar12);
      vdst.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      vdst.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      vdst.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      puVar82 = (faceVertexIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                ._M_impl.super__Vector_impl_data._M_start;
      puVar91 = (faceVertexIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                ._M_impl.super__Vector_impl_data._M_finish;
      uVar88 = (long)puVar91 - (long)puVar82 >> 2;
      bVar25 = false;
      if (((long)vsrc.
                 super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)vsrc.
                 super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start == uVar88) && (2 < uVar88)) {
        puVar22 = &uStack_178;
        paVar102 = &aStack_198;
        aStack_198._M_allocated_capacity._0_4_ = 0;
        aStack_198._M_allocated_capacity._4_4_ = 0;
        aStack_198._8_8_ = 0;
        _Stack_188._M_max_load_factor = 1.0;
        _Stack_188._M_next_resize._0_4_ = 0;
        _Stack_188._M_next_resize._4_4_ = 0;
        uStack_178 = 0;
        uStack_174 = 0;
        fVar99 = 0.0;
        uVar88 = 0;
        while( true ) {
          _ss_e = (uint)puVar22;
          uVar90 = (long)puVar91 - (long)puVar82 >> 2;
          if (uVar90 <= uVar88) break;
          fVar109 = (float)puVar82[uVar88];
          vidx = (uint32_t)fVar109;
          if ((uint)fVar99 < (uint)fVar109) {
            fVar99 = fVar109;
          }
          sVar48 = ::std::
                   _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_signed_char>,_std::allocator<std::pair<const_unsigned_int,_signed_char>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::count((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_signed_char>,_std::allocator<std::pair<const_unsigned_int,_signed_char>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                            *)&ss_e,&vidx);
          if (sVar48 == 0) {
            mVar6 = *(mapped_type *)
                     ((long)(vsrc.
                             super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_elems + uVar88);
            pmVar49 = ::std::__detail::
                      _Map_base<unsigned_int,_std::pair<const_unsigned_int,_signed_char>,_std::allocator<std::pair<const_unsigned_int,_signed_char>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_signed_char>,_std::allocator<std::pair<const_unsigned_int,_signed_char>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)&ss_e,&vidx);
            *pmVar49 = mVar6;
          }
          else {
            pmVar49 = ::std::__detail::
                      _Map_base<unsigned_int,_std::pair<const_unsigned_int,_signed_char>,_std::allocator<std::pair<const_unsigned_int,_signed_char>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_signed_char>,_std::allocator<std::pair<const_unsigned_int,_signed_char>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)&ss_e,&vidx);
            if (*pmVar49 !=
                *(char *)((long)(vsrc.
                                 super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->_M_elems + uVar88))
            goto LAB_00296e67;
          }
          puVar22 = (undefined4 *)(ulong)_ss_e;
          uVar88 = uVar88 + 1;
          puVar82 = (local_200->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          puVar91 = (local_200->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_finish;
        }
        ::std::vector<signed_char,_std::allocator<signed_char>_>::resize
                  ((vector<signed_char,_std::allocator<signed_char>_> *)&vdst,
                   (ulong)((int)fVar99 + 1));
        memset(vdst.
               super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start,0,(ulong)((int)fVar99 + 1));
        while (paVar102 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)paVar102->_M_allocated_capacity,
              paVar102 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
          *(char *)((long)(vdst.
                           super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_elems +
                   (ulong)(uint)(&paVar102->_M_allocated_capacity)[1]) = paVar102->_M_local_buf[0xc]
          ;
        }
LAB_00296e67:
        ::std::
        _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_signed_char>,_std::allocator<std::pair<const_unsigned_int,_signed_char>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_signed_char>,_std::allocator<std::pair<const_unsigned_int,_signed_char>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       *)&ss_e);
        if (uVar88 < uVar90) {
          bVar25 = false;
        }
        else {
          ::std::__cxx11::string::_M_assign((string *)dst);
          dst->elementSize = 1;
          dst->format = src->format;
          dst->variability = Vertex;
          lVar100 = (long)vdst.
                          super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)vdst.
                          super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
          sVar26 = VertexAttribute::format_size(src);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data,
                     lVar100 * sVar26);
          puVar12 = (dst->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          memcpy(puVar12,vdst.
                         super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                 (long)(dst->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)puVar12);
          bVar25 = true;
        }
      }
      ::std::_Vector_base<signed_char,_std::allocator<signed_char>_>::~_Vector_base
                ((_Vector_base<signed_char,_std::allocator<signed_char>_> *)&vdst);
      ::std::_Vector_base<signed_char,_std::allocator<signed_char>_>::~_Vector_base
                ((_Vector_base<signed_char,_std::allocator<signed_char>_> *)&vsrc);
      break;
    default:
      if (err != (string *)0x0) {
        ::std::__cxx11::string::string
                  ((string *)&vsrc,"Unsupported/Unimplemented VertexAttributeFormat: {}",
                   (allocator *)&vidx);
        tydra::to_string_abi_cxx11_((string *)&vdst,(tydra *)(ulong)src->format,f);
        fmt::format<std::__cxx11::string>
                  ((string *)&ss_e,(fmt *)&vsrc,(string *)&vdst,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)puVar87);
        ::std::__cxx11::string::append((string *)err);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
      }
      goto LAB_00293424;
    case Short:
      vsrc.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      vsrc.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      vsrc.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      sVar26 = VertexAttribute::vertex_count(src);
      ::std::vector<short,_std::allocator<short>_>::resize
                ((vector<short,_std::allocator<short>_> *)&vsrc,sVar26);
      puVar12 = (src->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start;
      memcpy(vsrc.
             super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start,puVar12,
             (long)(src->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish - (long)puVar12);
      vdst.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      vdst.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      vdst.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      puVar82 = (faceVertexIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                ._M_impl.super__Vector_impl_data._M_start;
      puVar91 = (faceVertexIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                ._M_impl.super__Vector_impl_data._M_finish;
      uVar88 = (long)puVar91 - (long)puVar82 >> 2;
      bVar25 = false;
      if (((long)vsrc.
                 super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)vsrc.
                 super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 1 == uVar88) && (2 < uVar88)) {
        puVar22 = &uStack_178;
        paVar102 = &aStack_198;
        aStack_198._M_allocated_capacity._0_4_ = 0;
        aStack_198._M_allocated_capacity._4_4_ = 0;
        aStack_198._8_8_ = 0;
        _Stack_188._M_max_load_factor = 1.0;
        _Stack_188._M_next_resize._0_4_ = 0;
        _Stack_188._M_next_resize._4_4_ = 0;
        uStack_178 = 0;
        uStack_174 = 0;
        fVar99 = 0.0;
        uVar88 = 0;
        while( true ) {
          _ss_e = (uint)puVar22;
          uVar90 = (long)puVar91 - (long)puVar82 >> 2;
          if (uVar90 <= uVar88) break;
          fVar109 = (float)puVar82[uVar88];
          vidx = (uint32_t)fVar109;
          if ((uint)fVar99 < (uint)fVar109) {
            fVar99 = fVar109;
          }
          sVar68 = ::std::
                   _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_short>,_std::allocator<std::pair<const_unsigned_int,_short>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::count((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_short>,_std::allocator<std::pair<const_unsigned_int,_short>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                            *)&ss_e,&vidx);
          if (sVar68 == 0) {
            mVar7 = *(mapped_type *)
                     ((long)(vsrc.
                             super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_elems + uVar88 * 2);
            pmVar69 = ::std::__detail::
                      _Map_base<unsigned_int,_std::pair<const_unsigned_int,_short>,_std::allocator<std::pair<const_unsigned_int,_short>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_short>,_std::allocator<std::pair<const_unsigned_int,_short>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)&ss_e,&vidx);
            *pmVar69 = mVar7;
          }
          else {
            pmVar69 = ::std::__detail::
                      _Map_base<unsigned_int,_std::pair<const_unsigned_int,_short>,_std::allocator<std::pair<const_unsigned_int,_short>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_short>,_std::allocator<std::pair<const_unsigned_int,_short>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)&ss_e,&vidx);
            if (*pmVar69 !=
                *(short *)((long)(vsrc.
                                  super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->_M_elems + uVar88 * 2)
               ) goto LAB_002973ed;
          }
          puVar22 = (undefined4 *)(ulong)_ss_e;
          uVar88 = uVar88 + 1;
          puVar82 = (local_200->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          puVar91 = (local_200->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_finish;
        }
        ::std::vector<short,_std::allocator<short>_>::resize
                  ((vector<short,_std::allocator<short>_> *)&vdst,(ulong)((int)fVar99 + 1));
        memset(vdst.
               super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start,0,(ulong)((int)fVar99 + 1) * 2);
        while (paVar102 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)paVar102->_M_allocated_capacity,
              paVar102 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
          *(undefined2 *)
           ((long)(vdst.
                   super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->_M_elems +
           (ulong)(uint)(&paVar102->_M_allocated_capacity)[1] * 2) =
               *(undefined2 *)(paVar102->_M_local_buf + 0xc);
        }
LAB_002973ed:
        ::std::
        _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_short>,_std::allocator<std::pair<const_unsigned_int,_short>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_short>,_std::allocator<std::pair<const_unsigned_int,_short>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       *)&ss_e);
        if (uVar88 < uVar90) {
          bVar25 = false;
        }
        else {
          ::std::__cxx11::string::_M_assign((string *)dst);
          dst->elementSize = 1;
          dst->format = src->format;
          dst->variability = Vertex;
          lVar100 = (long)vdst.
                          super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)vdst.
                          super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
          sVar26 = VertexAttribute::format_size(src);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data,
                     (lVar100 >> 1) * sVar26);
          puVar12 = (dst->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          memcpy(puVar12,vdst.
                         super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                 (long)(dst->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)puVar12);
          bVar25 = true;
        }
      }
      ::std::_Vector_base<short,_std::allocator<short>_>::~_Vector_base
                ((_Vector_base<short,_std::allocator<short>_> *)&vdst);
      ::std::_Vector_base<short,_std::allocator<short>_>::~_Vector_base
                ((_Vector_base<short,_std::allocator<short>_> *)&vsrc);
      break;
    case Ushort:
      vsrc.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      vsrc.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      vsrc.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      sVar26 = VertexAttribute::vertex_count(src);
      ::std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
                ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&vsrc,sVar26);
      puVar12 = (src->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start;
      memcpy(vsrc.
             super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start,puVar12,
             (long)(src->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish - (long)puVar12);
      vdst.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      vdst.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      vdst.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      puVar82 = (faceVertexIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                ._M_impl.super__Vector_impl_data._M_start;
      puVar91 = (faceVertexIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                ._M_impl.super__Vector_impl_data._M_finish;
      uVar88 = (long)puVar91 - (long)puVar82 >> 2;
      bVar25 = false;
      if (((long)vsrc.
                 super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)vsrc.
                 super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 1 == uVar88) && (2 < uVar88)) {
        puVar22 = &uStack_178;
        paVar102 = &aStack_198;
        aStack_198._M_allocated_capacity._0_4_ = 0;
        aStack_198._M_allocated_capacity._4_4_ = 0;
        aStack_198._8_8_ = 0;
        _Stack_188._M_max_load_factor = 1.0;
        _Stack_188._M_next_resize._0_4_ = 0;
        _Stack_188._M_next_resize._4_4_ = 0;
        uStack_178 = 0;
        uStack_174 = 0;
        fVar99 = 0.0;
        uVar88 = 0;
        while( true ) {
          _ss_e = (uint)puVar22;
          uVar90 = (long)puVar91 - (long)puVar82 >> 2;
          if (uVar90 <= uVar88) break;
          fVar109 = (float)puVar82[uVar88];
          vidx = (uint32_t)fVar109;
          if ((uint)fVar99 < (uint)fVar109) {
            fVar99 = fVar109;
          }
          sVar70 = ::std::
                   _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_short>,_std::allocator<std::pair<const_unsigned_int,_unsigned_short>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::count((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_short>,_std::allocator<std::pair<const_unsigned_int,_unsigned_short>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                            *)&ss_e,&vidx);
          if (sVar70 == 0) {
            mVar8 = *(mapped_type *)
                     ((long)(vsrc.
                             super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_elems + uVar88 * 2);
            pmVar71 = ::std::__detail::
                      _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_short>,_std::allocator<std::pair<const_unsigned_int,_unsigned_short>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_short>,_std::allocator<std::pair<const_unsigned_int,_unsigned_short>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)&ss_e,&vidx);
            *pmVar71 = mVar8;
          }
          else {
            pmVar71 = ::std::__detail::
                      _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_short>,_std::allocator<std::pair<const_unsigned_int,_unsigned_short>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_short>,_std::allocator<std::pair<const_unsigned_int,_unsigned_short>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)&ss_e,&vidx);
            if (*pmVar71 !=
                *(mapped_type *)
                 ((long)(vsrc.
                         super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_elems + uVar88 * 2))
            goto LAB_00297486;
          }
          puVar22 = (undefined4 *)(ulong)_ss_e;
          uVar88 = uVar88 + 1;
          puVar82 = (local_200->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          puVar91 = (local_200->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_finish;
        }
        ::std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
                  ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&vdst,
                   (ulong)((int)fVar99 + 1));
        memset(vdst.
               super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start,0,(ulong)((int)fVar99 + 1) * 2);
        while (paVar102 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)paVar102->_M_allocated_capacity,
              paVar102 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
          *(undefined2 *)
           ((long)(vdst.
                   super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->_M_elems +
           (ulong)(uint)(&paVar102->_M_allocated_capacity)[1] * 2) =
               *(undefined2 *)(paVar102->_M_local_buf + 0xc);
        }
LAB_00297486:
        ::std::
        _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_short>,_std::allocator<std::pair<const_unsigned_int,_unsigned_short>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_short>,_std::allocator<std::pair<const_unsigned_int,_unsigned_short>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       *)&ss_e);
        if (uVar88 < uVar90) {
          bVar25 = false;
        }
        else {
          ::std::__cxx11::string::_M_assign((string *)dst);
          dst->elementSize = 1;
          dst->format = src->format;
          dst->variability = Vertex;
          lVar100 = (long)vdst.
                          super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)vdst.
                          super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
          sVar26 = VertexAttribute::format_size(src);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data,
                     (lVar100 >> 1) * sVar26);
          puVar12 = (dst->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          memcpy(puVar12,vdst.
                         super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                 (long)(dst->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)puVar12);
          bVar25 = true;
        }
      }
      ::std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
                ((_Vector_base<unsigned_short,_std::allocator<unsigned_short>_> *)&vdst);
      ::std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
                ((_Vector_base<unsigned_short,_std::allocator<unsigned_short>_> *)&vsrc);
      break;
    case Half:
      vsrc.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      vsrc.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      vsrc.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      sVar26 = VertexAttribute::vertex_count(src);
      ::std::vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>::resize
                ((vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *)&vsrc,
                 sVar26);
      puVar12 = (src->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start;
      memcpy(vsrc.
             super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start,puVar12,
             (long)(src->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish - (long)puVar12);
      vdst.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      vdst.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      vdst.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      puVar82 = (faceVertexIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                ._M_impl.super__Vector_impl_data._M_start;
      puVar91 = (faceVertexIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                ._M_impl.super__Vector_impl_data._M_finish;
      uVar88 = (long)puVar91 - (long)puVar82 >> 2;
      bVar25 = false;
      if (((long)vsrc.
                 super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)vsrc.
                 super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 1 == uVar88) && (2 < uVar88)) {
        puVar22 = &uStack_178;
        paVar102 = &aStack_198;
        aStack_198._M_allocated_capacity._0_4_ = 0;
        aStack_198._M_allocated_capacity._4_4_ = 0;
        aStack_198._8_8_ = 0;
        _Stack_188._M_max_load_factor = 1.0;
        _Stack_188._M_next_resize._0_4_ = 0;
        _Stack_188._M_next_resize._4_4_ = 0;
        uStack_178 = 0;
        uStack_174 = 0;
        uVar90 = 0;
        uVar88 = 0;
        while( true ) {
          _ss_e = (uint)puVar22;
          uVar101 = (long)puVar91 - (long)puVar82 >> 2;
          if (uVar101 <= uVar90) break;
          fVar99 = (float)puVar82[uVar90];
          vidx = (uint32_t)fVar99;
          uVar95 = uVar88 & 0xffffffff;
          if ((uint)(float)uVar88 < (uint)fVar99) {
            uVar95 = (ulong)(uint)fVar99;
          }
          local_1f8._0_8_ = uVar95;
          sVar52 = ::std::
                   _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::value::half>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::value::half>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::count((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::value::half>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::value::half>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                            *)&ss_e,&vidx);
          paVar97 = vsrc.
                    super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (sVar52 == 0) {
            pmVar53 = ::std::__detail::
                      _Map_base<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::value::half>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::value::half>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::value::half>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::value::half>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)&ss_e,&vidx);
            pmVar53->value = *(uint16_t *)((long)paVar97->_M_elems + uVar90 * 2);
          }
          else {
            pmVar53 = ::std::__detail::
                      _Map_base<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::value::half>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::value::half>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::value::half>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::value::half>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)&ss_e,&vidx);
            bVar25 = math::is_close((half)pmVar53->value,
                                    (half)*(uint16_t *)
                                           ((long)(vsrc.
                                                  super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  _M_elems + uVar90 * 2),eps);
            if (!bVar25) goto LAB_00296efd;
          }
          puVar22 = (undefined4 *)(ulong)_ss_e;
          uVar90 = uVar90 + 1;
          puVar82 = (faceVertexIndices->
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          puVar91 = (faceVertexIndices->
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                    super__Vector_impl_data._M_finish;
          uVar88 = local_1f8._0_8_;
        }
        uVar88 = (ulong)((int)(float)uVar88 + 1);
        ::std::vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>::resize
                  ((vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *)&vdst,
                   uVar88);
        memset(vdst.
               super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start,0,uVar88 * 2);
        while (paVar102 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)paVar102->_M_allocated_capacity,
              paVar102 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
          *(undefined2 *)
           ((long)(vdst.
                   super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->_M_elems +
           (ulong)(uint)(&paVar102->_M_allocated_capacity)[1] * 2) =
               *(undefined2 *)(paVar102->_M_local_buf + 0xc);
        }
LAB_00296efd:
        ::std::
        _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::value::half>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::value::half>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::value::half>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::value::half>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       *)&ss_e);
        if (uVar90 < uVar101) {
          bVar25 = false;
        }
        else {
          ::std::__cxx11::string::_M_assign((string *)dst);
          dst->elementSize = 1;
          dst->format = src->format;
          dst->variability = Vertex;
          lVar100 = (long)vdst.
                          super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)vdst.
                          super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
          sVar26 = VertexAttribute::format_size(src);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data,
                     (lVar100 >> 1) * sVar26);
          puVar12 = (dst->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          memcpy(puVar12,vdst.
                         super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                 (long)(dst->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)puVar12);
          bVar25 = true;
        }
      }
      ::std::_Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>::
      ~_Vector_base((_Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *)
                    &vdst);
      ::std::_Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>::
      ~_Vector_base((_Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *)
                    &vsrc);
      break;
    case Half2:
      vsrc.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      vsrc.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      vsrc.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      sVar26 = VertexAttribute::vertex_count(src);
      ::std::
      vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
      ::resize((vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                *)&vsrc,sVar26);
      puVar12 = (src->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start;
      memcpy(vsrc.
             super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start,puVar12,
             (long)(src->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish - (long)puVar12);
      vdst.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      vdst.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      vdst.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      puVar82 = (faceVertexIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                ._M_impl.super__Vector_impl_data._M_start;
      puVar91 = (faceVertexIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                ._M_impl.super__Vector_impl_data._M_finish;
      fVar99 = 0.0;
      if (8 < (ulong)((long)puVar91 - (long)puVar82) &&
          (long)vsrc.
                super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)vsrc.
                super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                ._M_impl.super__Vector_impl_data._M_start == (long)puVar91 - (long)puVar82) {
        puVar22 = &uStack_178;
        paVar102 = &aStack_198;
        aStack_198._M_allocated_capacity._0_4_ = 0;
        aStack_198._M_allocated_capacity._4_4_ = 0;
        aStack_198._8_8_ = 0;
        _Stack_188._M_max_load_factor = 1.0;
        _Stack_188._M_next_resize._0_4_ = 0;
        _Stack_188._M_next_resize._4_4_ = 0;
        uStack_178 = 0;
        uStack_174 = 0;
        lVar100 = 0;
        uVar88 = 0;
        while( true ) {
          _ss_e = (uint)puVar22;
          uVar90 = (long)puVar91 - (long)puVar82 >> 2;
          local_1f8._0_8_ = uVar88;
          if (uVar90 <= uVar88) break;
          fVar109 = *(float *)((long)puVar82 + lVar100);
          vidx = (uint32_t)fVar109;
          if ((uint)fVar99 < (uint)fVar109) {
            fVar99 = fVar109;
          }
          sVar58 = ::std::
                   _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::array<tinyusdz::value::half,_2UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<tinyusdz::value::half,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::count((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::array<tinyusdz::value::half,_2UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<tinyusdz::value::half,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                            *)&ss_e,&vidx);
          paVar97 = vsrc.
                    super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (sVar58 == 0) {
            pmVar59 = ::std::__detail::
                      _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::array<tinyusdz::value::half,_2UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<tinyusdz::value::half,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::array<tinyusdz::value::half,_2UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<tinyusdz::value::half,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)&ss_e,&vidx);
            *(undefined4 *)pmVar59->_M_elems = *(undefined4 *)((long)paVar97->_M_elems + lVar100);
          }
          else {
            pmVar59 = ::std::__detail::
                      _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::array<tinyusdz::value::half,_2UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<tinyusdz::value::half,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::array<tinyusdz::value::half,_2UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<tinyusdz::value::half,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)&ss_e,&vidx);
            bVar25 = math::is_close(pmVar59,(half2 *)((long)(vsrc.
                                                  super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  _M_elems + lVar100),eps);
            if (!bVar25) goto LAB_002970d5;
          }
          puVar22 = (undefined4 *)(ulong)_ss_e;
          uVar88 = local_1f8._0_8_ + 1;
          puVar82 = (local_200->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          puVar91 = (local_200->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_finish;
          lVar100 = lVar100 + 4;
        }
        ::std::
        vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
        ::resize((vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                  *)&vdst,(ulong)((int)fVar99 + 1));
        memset(vdst.
               super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start,0,(ulong)((int)fVar99 + 1) << 2);
        while (paVar102 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)paVar102->_M_allocated_capacity,
              paVar102 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
          (vdst.
           super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->_M_elems
          [(uint)(&paVar102->_M_allocated_capacity)[1]] = *(uint *)(paVar102->_M_local_buf + 0xc);
        }
LAB_002970d5:
        ::std::
        _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::array<tinyusdz::value::half,_2UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<tinyusdz::value::half,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::array<tinyusdz::value::half,_2UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<tinyusdz::value::half,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       *)&ss_e);
        if ((ulong)local_1f8._0_8_ < uVar90) {
          fVar99 = 0.0;
        }
        else {
          ::std::__cxx11::string::_M_assign((string *)dst);
          dst->elementSize = 1;
          dst->format = src->format;
          dst->variability = Vertex;
          lVar100 = (long)vdst.
                          super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)vdst.
                          super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
          sVar26 = VertexAttribute::format_size(src);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data,
                     (lVar100 >> 2) * sVar26);
          puVar12 = (dst->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          memcpy(puVar12,vdst.
                         super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                 (long)(dst->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)puVar12);
          fVar99 = 1.4013e-45;
        }
      }
      bVar25 = SUB41(fVar99,0);
      ::std::
      _Vector_base<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
      ::~_Vector_base((_Vector_base<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                       *)&vdst);
      ::std::
      _Vector_base<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
      ::~_Vector_base((_Vector_base<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                       *)&vsrc);
      break;
    case Half3:
      vsrc.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      vsrc.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      vsrc.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      sVar26 = VertexAttribute::vertex_count(src);
      ::std::
      vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
      ::resize((vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                *)&vsrc,sVar26);
      puVar12 = (src->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start;
      memcpy(vsrc.
             super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start,puVar12,
             (long)(src->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish - (long)puVar12);
      vdst.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      vdst.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      vdst.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      puVar82 = (faceVertexIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                ._M_impl.super__Vector_impl_data._M_start;
      puVar91 = (faceVertexIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                ._M_impl.super__Vector_impl_data._M_finish;
      uVar88 = (long)puVar91 - (long)puVar82 >> 2;
      bVar25 = false;
      if ((((long)vsrc.
                  super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
           (long)vsrc.
                 super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start) / 6 == uVar88) && (2 < uVar88)) {
        puVar22 = &uStack_178;
        paVar102 = &aStack_198;
        aStack_198._M_allocated_capacity._0_4_ = 0;
        aStack_198._M_allocated_capacity._4_4_ = 0;
        aStack_198._8_8_ = 0;
        _Stack_188._M_max_load_factor = 1.0;
        _Stack_188._M_next_resize._0_4_ = 0;
        _Stack_188._M_next_resize._4_4_ = 0;
        uStack_178 = 0;
        uStack_174 = 0;
        lVar100 = 0;
        fVar99 = 0.0;
        uVar88 = 0;
        while( true ) {
          _ss_e = (uint)puVar22;
          uVar90 = (long)puVar91 - (long)puVar82 >> 2;
          local_1f8._0_8_ = uVar88;
          if (uVar90 <= uVar88) break;
          fVar109 = (float)puVar82[uVar88];
          vidx = (uint32_t)fVar109;
          if ((uint)fVar99 < (uint)fVar109) {
            fVar99 = fVar109;
          }
          sVar60 = ::std::
                   _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::array<tinyusdz::value::half,_3UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<tinyusdz::value::half,_3UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::count((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::array<tinyusdz::value::half,_3UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<tinyusdz::value::half,_3UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                            *)&ss_e,&vidx);
          paVar97 = vsrc.
                    super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (sVar60 == 0) {
            pmVar61 = ::std::__detail::
                      _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::array<tinyusdz::value::half,_3UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<tinyusdz::value::half,_3UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::array<tinyusdz::value::half,_3UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<tinyusdz::value::half,_3UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)&ss_e,&vidx);
            *(undefined4 *)pmVar61->_M_elems = *(undefined4 *)((long)paVar97->_M_elems + lVar100);
            pmVar61->_M_elems[2].value = *(uint16_t *)((long)paVar97->_M_elems + lVar100 + 4);
          }
          else {
            pmVar61 = ::std::__detail::
                      _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::array<tinyusdz::value::half,_3UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<tinyusdz::value::half,_3UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::array<tinyusdz::value::half,_3UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<tinyusdz::value::half,_3UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)&ss_e,&vidx);
            bVar25 = math::is_close(pmVar61,(half3 *)((long)(vsrc.
                                                  super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  _M_elems + lVar100),eps);
            if (!bVar25) goto LAB_00297171;
          }
          puVar22 = (undefined4 *)(ulong)_ss_e;
          uVar88 = local_1f8._0_8_ + 1;
          puVar82 = (local_200->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          puVar91 = (local_200->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_finish;
          lVar100 = lVar100 + 6;
        }
        ::std::
        vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
        ::resize((vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                  *)&vdst,(ulong)((int)fVar99 + 1));
        memset(vdst.
               super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start,0,(ulong)((int)fVar99 + 1) * 6);
        while (paVar102 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)paVar102->_M_allocated_capacity,
              paVar102 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
          uVar11 = *(undefined4 *)(paVar102->_M_local_buf + 0xc);
          lVar100 = (ulong)(uint)(&paVar102->_M_allocated_capacity)[1] * 6;
          *(short *)((long)(vdst.
                            super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar100 + 4) =
               (short)(&paVar102->_M_allocated_capacity)[2];
          *(undefined4 *)
           ((long)(vdst.
                   super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar100) = uVar11;
        }
LAB_00297171:
        ::std::
        _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::array<tinyusdz::value::half,_3UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<tinyusdz::value::half,_3UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::array<tinyusdz::value::half,_3UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<tinyusdz::value::half,_3UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       *)&ss_e);
        if ((ulong)local_1f8._0_8_ < uVar90) {
          bVar25 = false;
        }
        else {
          ::std::__cxx11::string::_M_assign((string *)dst);
          dst->elementSize = 1;
          dst->format = src->format;
          dst->variability = Vertex;
          lVar100 = (long)vdst.
                          super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)vdst.
                          super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
          sVar26 = VertexAttribute::format_size(src);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data,
                     (lVar100 / 6) * sVar26);
          puVar12 = (dst->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          memcpy(puVar12,vdst.
                         super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                 (long)(dst->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)puVar12);
          bVar25 = true;
        }
      }
      ::std::
      _Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
      ::~_Vector_base((_Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                       *)&vdst);
      ::std::
      _Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
      ::~_Vector_base((_Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                       *)&vsrc);
      break;
    case Half4:
      vsrc.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      vsrc.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      vsrc.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      sVar26 = VertexAttribute::vertex_count(src);
      ::std::
      vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
      ::resize((vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                *)&vsrc,sVar26);
      puVar12 = (src->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start;
      memcpy(vsrc.
             super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start,puVar12,
             (long)(src->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish - (long)puVar12);
      vdst.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      vdst.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      vdst.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      puVar82 = (faceVertexIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                ._M_impl.super__Vector_impl_data._M_start;
      puVar91 = (faceVertexIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                ._M_impl.super__Vector_impl_data._M_finish;
      uVar88 = (long)puVar91 - (long)puVar82 >> 2;
      bVar25 = false;
      if (((long)vsrc.
                 super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)vsrc.
                 super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3 == uVar88) && (2 < uVar88)) {
        puVar22 = &uStack_178;
        paVar102 = &aStack_198;
        aStack_198._M_allocated_capacity._0_4_ = 0;
        aStack_198._M_allocated_capacity._4_4_ = 0;
        aStack_198._8_8_ = 0;
        _Stack_188._M_max_load_factor = 1.0;
        _Stack_188._M_next_resize._0_4_ = 0;
        _Stack_188._M_next_resize._4_4_ = 0;
        uStack_178 = 0;
        uStack_174 = 0;
        auVar21._8_8_ = 0;
        auVar21._0_8_ = local_1f8._8_8_;
        local_1f8 = auVar21 << 0x40;
        fVar99 = 0.0;
        uVar88 = 0;
        while( true ) {
          _ss_e = (uint)puVar22;
          uVar90 = (long)puVar91 - (long)puVar82 >> 2;
          if (uVar90 <= uVar88) break;
          fVar109 = (float)puVar82[uVar88];
          vidx = (uint32_t)fVar109;
          if ((uint)fVar99 < (uint)fVar109) {
            fVar99 = fVar109;
          }
          sVar74 = ::std::
                   _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::array<tinyusdz::value::half,_4UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<tinyusdz::value::half,_4UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::count((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::array<tinyusdz::value::half,_4UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<tinyusdz::value::half,_4UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                            *)&ss_e,&vidx);
          paVar97 = vsrc.
                    super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (sVar74 == 0) {
            pmVar75 = ::std::__detail::
                      _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::array<tinyusdz::value::half,_4UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<tinyusdz::value::half,_4UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::array<tinyusdz::value::half,_4UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<tinyusdz::value::half,_4UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)&ss_e,&vidx);
            *(undefined8 *)pmVar75->_M_elems =
                 *(undefined8 *)((long)paVar97->_M_elems + local_1f8._0_8_);
            lVar100 = local_1f8._0_8_;
          }
          else {
            pmVar75 = ::std::__detail::
                      _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::array<tinyusdz::value::half,_4UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<tinyusdz::value::half,_4UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::array<tinyusdz::value::half,_4UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<tinyusdz::value::half,_4UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)&ss_e,&vidx);
            lVar100 = local_1f8._0_8_;
            bVar25 = math::is_close(pmVar75,(half4 *)((long)(vsrc.
                                                  super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  _M_elems + local_1f8._0_8_),eps);
            if (!bVar25) goto LAB_002975b9;
          }
          puVar22 = (undefined4 *)(ulong)_ss_e;
          uVar88 = uVar88 + 1;
          puVar82 = (local_200->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          puVar91 = (local_200->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_finish;
          local_1f8._0_8_ = lVar100 + 8;
        }
        ::std::
        vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
        ::resize((vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                  *)&vdst,(ulong)((int)fVar99 + 1));
        memset(vdst.
               super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start,0,(ulong)((int)fVar99 + 1) << 3);
        while (paVar102 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)paVar102->_M_allocated_capacity,
              paVar102 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
          *(undefined8 *)
           vdst.
           super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
           ._M_impl.super__Vector_impl_data._M_start[(uint)(&paVar102->_M_allocated_capacity)[1]].
           _M_elems = *(undefined8 *)(paVar102->_M_local_buf + 0xc);
        }
LAB_002975b9:
        ::std::
        _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::array<tinyusdz::value::half,_4UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<tinyusdz::value::half,_4UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::array<tinyusdz::value::half,_4UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<tinyusdz::value::half,_4UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       *)&ss_e);
        if (uVar88 < uVar90) {
          bVar25 = false;
        }
        else {
          ::std::__cxx11::string::_M_assign((string *)dst);
          dst->elementSize = 1;
          dst->format = src->format;
          dst->variability = Vertex;
          lVar100 = (long)vdst.
                          super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)vdst.
                          super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
          sVar26 = VertexAttribute::format_size(src);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data,
                     (lVar100 >> 3) * sVar26);
          puVar12 = (dst->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          memcpy(puVar12,vdst.
                         super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                 (long)(dst->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)puVar12);
          bVar25 = true;
        }
      }
      ::std::
      _Vector_base<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
      ::~_Vector_base((_Vector_base<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                       *)&vdst);
      ::std::
      _Vector_base<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
      ::~_Vector_base((_Vector_base<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                       *)&vsrc);
      break;
    case Float:
      vsrc.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      vsrc.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      vsrc.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      sVar26 = VertexAttribute::vertex_count(src);
      ::std::vector<float,_std::allocator<float>_>::resize
                ((vector<float,_std::allocator<float>_> *)&vsrc,sVar26);
      puVar12 = (src->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start;
      memcpy(vsrc.
             super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start,puVar12,
             (long)(src->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish - (long)puVar12);
      vdst.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      vdst.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      vdst.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      puVar82 = (faceVertexIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                ._M_impl.super__Vector_impl_data._M_start;
      puVar91 = (faceVertexIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                ._M_impl.super__Vector_impl_data._M_finish;
      fVar99 = 0.0;
      if (8 < (ulong)((long)puVar91 - (long)puVar82) &&
          (long)vsrc.
                super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)vsrc.
                super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                ._M_impl.super__Vector_impl_data._M_start == (long)puVar91 - (long)puVar82) {
        puVar22 = &uStack_178;
        paVar102 = &aStack_198;
        aStack_198._M_allocated_capacity._0_4_ = 0;
        aStack_198._M_allocated_capacity._4_4_ = 0;
        aStack_198._8_8_ = 0;
        _Stack_188._M_max_load_factor = 1.0;
        _Stack_188._M_next_resize._0_4_ = 0;
        _Stack_188._M_next_resize._4_4_ = 0;
        uStack_178 = 0;
        uStack_174 = 0;
        uVar88 = 0;
        while( true ) {
          _ss_e = (uint)puVar22;
          uVar90 = (long)puVar91 - (long)puVar82 >> 2;
          if (uVar90 <= uVar88) break;
          fVar109 = (float)puVar82[uVar88];
          vidx = (uint32_t)fVar109;
          if ((uint)fVar99 < (uint)fVar109) {
            fVar99 = fVar109;
          }
          sVar72 = ::std::
                   _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_float>,_std::allocator<std::pair<const_unsigned_int,_float>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::count((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_float>,_std::allocator<std::pair<const_unsigned_int,_float>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                            *)&ss_e,&vidx);
          if (sVar72 == 0) {
            local_1f8._0_4_ =
                 (vsrc.
                  super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->_M_elems[uVar88];
            pmVar73 = ::std::__detail::
                      _Map_base<unsigned_int,_std::pair<const_unsigned_int,_float>,_std::allocator<std::pair<const_unsigned_int,_float>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_float>,_std::allocator<std::pair<const_unsigned_int,_float>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)&ss_e,&vidx);
            *pmVar73 = (mapped_type)local_1f8._0_4_;
          }
          else {
            pmVar73 = ::std::__detail::
                      _Map_base<unsigned_int,_std::pair<const_unsigned_int,_float>,_std::allocator<std::pair<const_unsigned_int,_float>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_float>,_std::allocator<std::pair<const_unsigned_int,_float>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)&ss_e,&vidx);
            fVar109 = ABS(*pmVar73 -
                          (float)(vsrc.
                                  super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->_M_elems[uVar88]);
            if (eps < fVar109) {
              local_1f8 = ZEXT416((uint)fVar109);
              fVar109 = fmaxf(ABS(*pmVar73),
                              ABS((float)(vsrc.
                                          super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->_M_elems
                                         [uVar88]));
              if (fVar109 * eps < (float)local_1f8._0_4_) goto LAB_0029795e;
            }
          }
          puVar22 = (undefined4 *)(ulong)_ss_e;
          uVar88 = uVar88 + 1;
          puVar82 = (local_200->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          puVar91 = (local_200->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_finish;
        }
        ::std::vector<float,_std::allocator<float>_>::resize
                  ((vector<float,_std::allocator<float>_> *)&vdst,(ulong)((int)fVar99 + 1));
        memset(vdst.
               super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start,0,(ulong)((int)fVar99 + 1) << 2);
        while (paVar102 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)paVar102->_M_allocated_capacity,
              paVar102 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
          (vdst.
           super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->_M_elems
          [(uint)(&paVar102->_M_allocated_capacity)[1]] = *(uint *)(paVar102->_M_local_buf + 0xc);
        }
LAB_0029795e:
        ::std::
        _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_float>,_std::allocator<std::pair<const_unsigned_int,_float>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_float>,_std::allocator<std::pair<const_unsigned_int,_float>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       *)&ss_e);
        if (uVar88 < uVar90) {
          fVar99 = 0.0;
        }
        else {
          ::std::__cxx11::string::_M_assign((string *)dst);
          dst->elementSize = 1;
          dst->format = src->format;
          dst->variability = Vertex;
          lVar100 = (long)vdst.
                          super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)vdst.
                          super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
          sVar26 = VertexAttribute::format_size(src);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data,
                     (lVar100 >> 2) * sVar26);
          puVar12 = (dst->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          memcpy(puVar12,vdst.
                         super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                 (long)(dst->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)puVar12);
          fVar99 = 1.4013e-45;
        }
      }
      bVar25 = SUB41(fVar99,0);
      ::std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                ((_Vector_base<float,_std::allocator<float>_> *)&vdst);
      ::std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                ((_Vector_base<float,_std::allocator<float>_> *)&vsrc);
      break;
    case Vec2:
      vsrc.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      vsrc.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      vsrc.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      sVar26 = VertexAttribute::vertex_count(src);
      ::std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>::resize
                ((vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *)&vsrc,
                 sVar26);
      puVar12 = (src->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start;
      memcpy(vsrc.
             super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start,puVar12,
             (long)(src->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish - (long)puVar12);
      vdst.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      vdst.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      vdst.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      puVar82 = (faceVertexIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                ._M_impl.super__Vector_impl_data._M_start;
      puVar91 = (faceVertexIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                ._M_impl.super__Vector_impl_data._M_finish;
      uVar88 = (long)puVar91 - (long)puVar82 >> 2;
      bVar25 = false;
      if (((long)vsrc.
                 super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)vsrc.
                 super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3 == uVar88) && (2 < uVar88)) {
        puVar22 = &uStack_178;
        paVar102 = &aStack_198;
        aStack_198._M_allocated_capacity._0_4_ = 0;
        aStack_198._M_allocated_capacity._4_4_ = 0;
        aStack_198._8_8_ = 0;
        _Stack_188._M_max_load_factor = 1.0;
        _Stack_188._M_next_resize._0_4_ = 0;
        _Stack_188._M_next_resize._4_4_ = 0;
        uStack_178 = 0;
        uStack_174 = 0;
        auVar19._8_8_ = 0;
        auVar19._0_8_ = local_1f8._8_8_;
        local_1f8 = auVar19 << 0x40;
        fVar99 = 0.0;
        uVar88 = 0;
        while( true ) {
          _ss_e = (uint)puVar22;
          uVar90 = (long)puVar91 - (long)puVar82 >> 2;
          if (uVar90 <= uVar88) break;
          fVar109 = (float)puVar82[uVar88];
          vidx = (uint32_t)fVar109;
          if ((uint)fVar99 < (uint)fVar109) {
            fVar99 = fVar109;
          }
          sVar38 = ::std::
                   _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::array<float,_2UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<float,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::count((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::array<float,_2UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<float,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                            *)&ss_e,&vidx);
          paVar97 = vsrc.
                    super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (sVar38 == 0) {
            pmVar39 = ::std::__detail::
                      _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::array<float,_2UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<float,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::array<float,_2UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<float,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)&ss_e,&vidx);
            *(undefined8 *)pmVar39->_M_elems =
                 *(undefined8 *)((long)paVar97->_M_elems + local_1f8._0_8_);
            lVar100 = local_1f8._0_8_;
          }
          else {
            pmVar39 = ::std::__detail::
                      _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::array<float,_2UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<float,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::array<float,_2UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<float,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)&ss_e,&vidx);
            lVar100 = local_1f8._0_8_;
            bVar25 = math::is_close(pmVar39,(float2 *)
                                            ((long)(vsrc.
                                                  super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  _M_elems + local_1f8._0_8_),eps);
            if (!bVar25) goto LAB_00296b5c;
          }
          puVar22 = (undefined4 *)(ulong)_ss_e;
          uVar88 = uVar88 + 1;
          puVar82 = (local_200->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          puVar91 = (local_200->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_finish;
          local_1f8._0_8_ = lVar100 + 8;
        }
        ::std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>::resize
                  ((vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *)&vdst
                   ,(ulong)((int)fVar99 + 1));
        memset(vdst.
               super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start,0,(ulong)((int)fVar99 + 1) << 3);
        while (paVar102 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)paVar102->_M_allocated_capacity,
              paVar102 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
          *(undefined8 *)
           vdst.
           super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
           ._M_impl.super__Vector_impl_data._M_start[(uint)(&paVar102->_M_allocated_capacity)[1]].
           _M_elems = *(undefined8 *)(paVar102->_M_local_buf + 0xc);
        }
LAB_00296b5c:
        ::std::
        _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::array<float,_2UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<float,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::array<float,_2UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<float,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       *)&ss_e);
        if (uVar88 < uVar90) {
          bVar25 = false;
        }
        else {
          ::std::__cxx11::string::_M_assign((string *)dst);
          dst->elementSize = 1;
          dst->format = src->format;
          dst->variability = Vertex;
          lVar100 = (long)vdst.
                          super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)vdst.
                          super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
          sVar26 = VertexAttribute::format_size(src);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data,
                     (lVar100 >> 3) * sVar26);
          puVar12 = (dst->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          memcpy(puVar12,vdst.
                         super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                 (long)(dst->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)puVar12);
          bVar25 = true;
        }
      }
      ::std::_Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>::
      ~_Vector_base((_Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                     *)&vdst);
      ::std::_Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>::
      ~_Vector_base((_Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                     *)&vsrc);
      break;
    case Vec3:
      vsrc.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      vsrc.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      vsrc.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      sVar26 = VertexAttribute::vertex_count(src);
      ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::resize
                ((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)&vsrc,
                 sVar26);
      puVar12 = (src->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start;
      memcpy(vsrc.
             super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start,puVar12,
             (long)(src->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish - (long)puVar12);
      vdst.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      vdst.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      vdst.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      puVar82 = (faceVertexIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                ._M_impl.super__Vector_impl_data._M_start;
      puVar91 = (faceVertexIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                ._M_impl.super__Vector_impl_data._M_finish;
      uVar88 = (long)puVar91 - (long)puVar82 >> 2;
      bVar25 = false;
      if ((((long)vsrc.
                  super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
           (long)vsrc.
                 super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start) / 0xc == uVar88) && (2 < uVar88)) {
        puVar22 = &uStack_178;
        paVar102 = &aStack_198;
        aStack_198._M_allocated_capacity._0_4_ = 0;
        aStack_198._M_allocated_capacity._4_4_ = 0;
        aStack_198._8_8_ = 0;
        _Stack_188._M_max_load_factor = 1.0;
        _Stack_188._M_next_resize._0_4_ = 0;
        _Stack_188._M_next_resize._4_4_ = 0;
        uStack_178 = 0;
        uStack_174 = 0;
        lVar100 = 0;
        fVar99 = 0.0;
        uVar88 = 0;
        while( true ) {
          _ss_e = (uint)puVar22;
          uVar90 = (long)puVar91 - (long)puVar82 >> 2;
          local_1f8._0_8_ = uVar88;
          if (uVar90 <= uVar88) break;
          fVar109 = (float)puVar82[uVar88];
          vidx = (uint32_t)fVar109;
          if ((uint)fVar99 < (uint)fVar109) {
            fVar99 = fVar109;
          }
          sVar54 = ::std::
                   _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::array<float,_3UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<float,_3UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::count((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::array<float,_3UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<float,_3UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                            *)&ss_e,&vidx);
          paVar97 = vsrc.
                    super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (sVar54 == 0) {
            pmVar55 = ::std::__detail::
                      _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::array<float,_3UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<float,_3UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::array<float,_3UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<float,_3UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)&ss_e,&vidx);
            *(undefined8 *)pmVar55->_M_elems = *(undefined8 *)((long)paVar97->_M_elems + lVar100);
            pmVar55->_M_elems[2] = *(float *)((long)paVar97[1]._M_elems + lVar100);
          }
          else {
            pmVar55 = ::std::__detail::
                      _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::array<float,_3UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<float,_3UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::array<float,_3UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<float,_3UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)&ss_e,&vidx);
            bVar25 = math::is_close(pmVar55,(float3 *)
                                            ((long)(vsrc.
                                                  super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  _M_elems + lVar100),eps);
            if (!bVar25) goto LAB_00296f96;
          }
          puVar22 = (undefined4 *)(ulong)_ss_e;
          uVar88 = local_1f8._0_8_ + 1;
          puVar82 = (local_200->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          puVar91 = (local_200->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_finish;
          lVar100 = lVar100 + 0xc;
        }
        ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::resize
                  ((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)&vdst
                   ,(ulong)((int)fVar99 + 1));
        memset(vdst.
               super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start,0,(ulong)((int)fVar99 + 1) * 0xc);
        while (paVar102 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)paVar102->_M_allocated_capacity,
              paVar102 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
          lVar100 = (ulong)(uint)(&paVar102->_M_allocated_capacity)[1] * 0xc;
          *(undefined4 *)
           ((long)vdst.
                  super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + lVar100 + 8) =
               *(undefined4 *)((long)paVar102 + 0x14);
          *(undefined8 *)
           ((long)vdst.
                  super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + lVar100) =
               *(undefined8 *)(paVar102->_M_local_buf + 0xc);
        }
LAB_00296f96:
        ::std::
        _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::array<float,_3UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<float,_3UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::array<float,_3UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<float,_3UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       *)&ss_e);
        if ((ulong)local_1f8._0_8_ < uVar90) {
          bVar25 = false;
        }
        else {
          ::std::__cxx11::string::_M_assign((string *)dst);
          dst->elementSize = 1;
          dst->format = src->format;
          dst->variability = Vertex;
          lVar100 = (long)vdst.
                          super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)vdst.
                          super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
          sVar26 = VertexAttribute::format_size(src);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data,
                     (lVar100 / 0xc) * sVar26);
          puVar12 = (dst->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          memcpy(puVar12,vdst.
                         super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                 (long)(dst->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)puVar12);
          bVar25 = true;
        }
      }
      ::std::_Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::
      ~_Vector_base((_Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                     *)&vdst);
      ::std::_Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::
      ~_Vector_base((_Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                     *)&vsrc);
      break;
    case Vec4:
      vsrc.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      vsrc.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      vsrc.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      sVar26 = VertexAttribute::vertex_count(src);
      ::std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>::resize
                ((vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> *)&vsrc,
                 sVar26);
      puVar12 = (src->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start;
      memcpy(vsrc.
             super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start,puVar12,
             (long)(src->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish - (long)puVar12);
      vdst.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      vdst.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      vdst.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      puVar82 = (faceVertexIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                ._M_impl.super__Vector_impl_data._M_start;
      puVar91 = (faceVertexIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                ._M_impl.super__Vector_impl_data._M_finish;
      uVar88 = (long)puVar91 - (long)puVar82 >> 2;
      bVar25 = false;
      if (((long)vsrc.
                 super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)vsrc.
                 super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 4 == uVar88) && (2 < uVar88)) {
        puVar22 = &uStack_178;
        paVar102 = &aStack_198;
        aStack_198._M_allocated_capacity._0_4_ = 0;
        aStack_198._M_allocated_capacity._4_4_ = 0;
        aStack_198._8_8_ = 0;
        _Stack_188._M_max_load_factor = 1.0;
        _Stack_188._M_next_resize._0_4_ = 0;
        _Stack_188._M_next_resize._4_4_ = 0;
        uStack_178 = 0;
        uStack_174 = 0;
        auVar20._8_8_ = 0;
        auVar20._0_8_ = local_1f8._8_8_;
        local_1f8 = auVar20 << 0x40;
        fVar99 = 0.0;
        uVar88 = 0;
        while( true ) {
          _ss_e = (uint)puVar22;
          uVar90 = (long)puVar91 - (long)puVar82 >> 2;
          if (uVar90 <= uVar88) break;
          fVar109 = (float)puVar82[uVar88];
          vidx = (uint32_t)fVar109;
          if ((uint)fVar99 < (uint)fVar109) {
            fVar99 = fVar109;
          }
          sVar44 = ::std::
                   _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::array<float,_4UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<float,_4UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::count((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::array<float,_4UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<float,_4UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                            *)&ss_e,&vidx);
          paVar97 = vsrc.
                    super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (sVar44 == 0) {
            pmVar45 = ::std::__detail::
                      _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::array<float,_4UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<float,_4UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::array<float,_4UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<float,_4UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)&ss_e,&vidx);
            puVar98 = (undefined8 *)((long)paVar97->_M_elems + local_1f8._0_8_);
            uVar14 = puVar98[1];
            *(undefined8 *)pmVar45->_M_elems = *puVar98;
            *(undefined8 *)(pmVar45->_M_elems + 2) = uVar14;
            lVar100 = local_1f8._0_8_;
          }
          else {
            pmVar45 = ::std::__detail::
                      _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::array<float,_4UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<float,_4UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::array<float,_4UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<float,_4UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)&ss_e,&vidx);
            lVar100 = local_1f8._0_8_;
            bVar25 = math::is_close(pmVar45,(float4 *)
                                            ((long)(vsrc.
                                                  super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  _M_elems + local_1f8._0_8_),eps);
            if (!bVar25) goto LAB_00296d2a;
          }
          puVar22 = (undefined4 *)(ulong)_ss_e;
          uVar88 = uVar88 + 1;
          puVar82 = (local_200->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          puVar91 = (local_200->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_finish;
          local_1f8._0_8_ = lVar100 + 0x10;
        }
        ::std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>::resize
                  ((vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> *)&vdst
                   ,(ulong)((int)fVar99 + 1));
        memset(vdst.
               super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start,0,(ulong)((int)fVar99 + 1) << 4);
        while (paVar102 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)paVar102->_M_allocated_capacity,
              paVar102 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
          sVar23 = (&paVar102->_M_allocated_capacity)[1];
          uVar14 = *(undefined8 *)((long)paVar102 + 0x14);
          *(undefined8 *)
           vdst.
           super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
           ._M_impl.super__Vector_impl_data._M_start[(ulong)(uint)sVar23 * 2]._M_elems =
               *(undefined8 *)(paVar102->_M_local_buf + 0xc);
          *(undefined8 *)
           (vdst.
            super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
            ._M_impl.super__Vector_impl_data._M_start + (ulong)(uint)sVar23 * 2)[1]._M_elems =
               uVar14;
        }
LAB_00296d2a:
        ::std::
        _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::array<float,_4UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<float,_4UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::array<float,_4UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<float,_4UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       *)&ss_e);
        if (uVar88 < uVar90) {
          bVar25 = false;
        }
        else {
          ::std::__cxx11::string::_M_assign((string *)dst);
          dst->elementSize = 1;
          dst->format = src->format;
          dst->variability = Vertex;
          lVar100 = (long)vdst.
                          super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)vdst.
                          super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
          sVar26 = VertexAttribute::format_size(src);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data,
                     (lVar100 >> 4) * sVar26);
          puVar12 = (dst->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          memcpy(puVar12,vdst.
                         super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                 (long)(dst->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)puVar12);
          bVar25 = true;
        }
      }
      ::std::_Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>::
      ~_Vector_base((_Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                     *)&vdst);
      ::std::_Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>::
      ~_Vector_base((_Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                     *)&vsrc);
      break;
    case Int:
      vsrc.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      vsrc.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      vsrc.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      sVar26 = VertexAttribute::vertex_count(src);
      ::std::vector<int,_std::allocator<int>_>::resize
                ((vector<int,_std::allocator<int>_> *)&vsrc,sVar26);
      puVar12 = (src->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start;
      memcpy(vsrc.
             super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start,puVar12,
             (long)(src->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish - (long)puVar12);
      vdst.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      vdst.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      vdst.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      puVar82 = (faceVertexIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                ._M_impl.super__Vector_impl_data._M_start;
      puVar91 = (faceVertexIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                ._M_impl.super__Vector_impl_data._M_finish;
      fVar99 = 0.0;
      if (8 < (ulong)((long)puVar91 - (long)puVar82) &&
          (long)vsrc.
                super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)vsrc.
                super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                ._M_impl.super__Vector_impl_data._M_start == (long)puVar91 - (long)puVar82) {
        puVar22 = &uStack_178;
        paVar102 = &aStack_198;
        aStack_198._M_allocated_capacity._0_4_ = 0;
        aStack_198._M_allocated_capacity._4_4_ = 0;
        aStack_198._8_8_ = 0;
        _Stack_188._M_max_load_factor = 1.0;
        _Stack_188._M_next_resize._0_4_ = 0;
        _Stack_188._M_next_resize._4_4_ = 0;
        uStack_178 = 0;
        uStack_174 = 0;
        uVar88 = 0;
        while( true ) {
          _ss_e = (uint)puVar22;
          uVar90 = (long)puVar91 - (long)puVar82 >> 2;
          if (uVar90 <= uVar88) break;
          fVar109 = (float)puVar82[uVar88];
          vidx = (uint32_t)fVar109;
          if ((uint)fVar99 < (uint)fVar109) {
            fVar99 = fVar109;
          }
          sVar33 = ::std::
                   _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::count((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                            *)&ss_e,&vidx);
          if (sVar33 == 0) {
            uVar93 = (vsrc.
                      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->_M_elems[uVar88];
            puVar87 = (uint *)::std::__detail::
                              _Map_base<unsigned_int,_std::pair<const_unsigned_int,_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                            *)&ss_e,&vidx);
            *puVar87 = uVar93;
          }
          else {
            puVar87 = (uint *)::std::__detail::
                              _Map_base<unsigned_int,_std::pair<const_unsigned_int,_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                            *)&ss_e,&vidx);
            if (*puVar87 !=
                (vsrc.
                 super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->_M_elems[uVar88]) goto LAB_00296985;
          }
          puVar22 = (undefined4 *)(ulong)_ss_e;
          uVar88 = uVar88 + 1;
          puVar82 = (local_200->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          puVar91 = (local_200->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_finish;
        }
        ::std::vector<int,_std::allocator<int>_>::resize
                  ((vector<int,_std::allocator<int>_> *)&vdst,(ulong)((int)fVar99 + 1));
        memset(vdst.
               super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start,0,(ulong)((int)fVar99 + 1) << 2);
        while (paVar102 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)paVar102->_M_allocated_capacity,
              paVar102 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
          (vdst.
           super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->_M_elems
          [(uint)(&paVar102->_M_allocated_capacity)[1]] = *(uint *)(paVar102->_M_local_buf + 0xc);
        }
LAB_00296985:
        ::std::
        _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       *)&ss_e);
        if (uVar88 < uVar90) {
          fVar99 = 0.0;
        }
        else {
          ::std::__cxx11::string::_M_assign((string *)dst);
          dst->elementSize = 1;
          dst->format = src->format;
          dst->variability = Vertex;
          lVar100 = (long)vdst.
                          super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)vdst.
                          super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
          sVar26 = VertexAttribute::format_size(src);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data,
                     (lVar100 >> 2) * sVar26);
          puVar12 = (dst->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          memcpy(puVar12,vdst.
                         super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                 (long)(dst->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)puVar12);
          fVar99 = 1.4013e-45;
        }
      }
      bVar25 = SUB41(fVar99,0);
      ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&vdst);
      ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&vsrc);
      break;
    case Ivec2:
      vsrc.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      vsrc.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      vsrc.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      sVar26 = VertexAttribute::vertex_count(src);
      ::std::vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>::resize
                ((vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_> *)&vsrc,
                 sVar26);
      puVar12 = (src->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start;
      memcpy(vsrc.
             super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start,puVar12,
             (long)(src->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish - (long)puVar12);
      vdst.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      vdst.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      vdst.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      puVar82 = (faceVertexIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                ._M_impl.super__Vector_impl_data._M_start;
      puVar91 = (faceVertexIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                ._M_impl.super__Vector_impl_data._M_finish;
      uVar88 = (long)puVar91 - (long)puVar82 >> 2;
      bVar25 = false;
      if (((long)vsrc.
                 super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)vsrc.
                 super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3 == uVar88) && (2 < uVar88)) {
        puVar22 = &uStack_178;
        paVar102 = &aStack_198;
        aStack_198._M_allocated_capacity._0_4_ = 0;
        aStack_198._M_allocated_capacity._4_4_ = 0;
        aStack_198._8_8_ = 0;
        _Stack_188._M_max_load_factor = 1.0;
        _Stack_188._M_next_resize._0_4_ = 0;
        _Stack_188._M_next_resize._4_4_ = 0;
        uStack_178 = 0;
        uStack_174 = 0;
        fVar99 = 0.0;
        uVar88 = 0;
        while( true ) {
          _ss_e = (uint)puVar22;
          uVar90 = (long)puVar91 - (long)puVar82 >> 2;
          if (uVar90 <= uVar88) break;
          fVar109 = (float)puVar82[uVar88];
          vidx = (uint32_t)fVar109;
          if ((uint)fVar99 < (uint)fVar109) {
            fVar99 = fVar109;
          }
          sVar62 = ::std::
                   _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::array<int,_2UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<int,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::count((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::array<int,_2UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<int,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                            *)&ss_e,&vidx);
          paVar97 = vsrc.
                    super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (sVar62 == 0) {
            pmVar63 = ::std::__detail::
                      _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::array<int,_2UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<int,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::array<int,_2UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<int,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)&ss_e,&vidx);
            *(undefined8 *)pmVar63->_M_elems = *(undefined8 *)paVar97[uVar88]._M_elems;
          }
          else {
            pmVar63 = ::std::__detail::
                      _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::array<int,_2UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<int,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::array<int,_2UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<int,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)&ss_e,&vidx);
            iVar107 = -(uint)((int)*(undefined8 *)
                                    vsrc.
                                    super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[uVar88]._M_elems ==
                             (int)*(undefined8 *)pmVar63->_M_elems);
            iVar108 = -(uint)((int)((ulong)*(undefined8 *)
                                            vsrc.
                                            super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start[uVar88].
                                            _M_elems >> 0x20) ==
                             (int)((ulong)*(undefined8 *)pmVar63->_M_elems >> 0x20));
            auVar106._4_4_ = iVar107;
            auVar106._0_4_ = iVar107;
            auVar106._8_4_ = iVar108;
            auVar106._12_4_ = iVar108;
            iVar107 = movmskpd((int)pmVar63,auVar106);
            if (iVar107 != 3) goto LAB_00297214;
          }
          puVar22 = (undefined4 *)(ulong)_ss_e;
          uVar88 = uVar88 + 1;
          puVar82 = (local_200->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          puVar91 = (local_200->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_finish;
        }
        ::std::vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>::resize
                  ((vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_> *)&vdst,
                   (ulong)((int)fVar99 + 1));
        memset(vdst.
               super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start,0,(ulong)((int)fVar99 + 1) << 3);
        while (paVar102 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)paVar102->_M_allocated_capacity,
              paVar102 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
          *(undefined8 *)
           vdst.
           super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
           ._M_impl.super__Vector_impl_data._M_start[(uint)(&paVar102->_M_allocated_capacity)[1]].
           _M_elems = *(undefined8 *)(paVar102->_M_local_buf + 0xc);
        }
LAB_00297214:
        ::std::
        _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::array<int,_2UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<int,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::array<int,_2UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<int,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       *)&ss_e);
        if (uVar88 < uVar90) {
          bVar25 = false;
        }
        else {
          ::std::__cxx11::string::_M_assign((string *)dst);
          dst->elementSize = 1;
          dst->format = src->format;
          dst->variability = Vertex;
          lVar100 = (long)vdst.
                          super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)vdst.
                          super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
          sVar26 = VertexAttribute::format_size(src);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data,
                     (lVar100 >> 3) * sVar26);
          puVar12 = (dst->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          memcpy(puVar12,vdst.
                         super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                 (long)(dst->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)puVar12);
          bVar25 = true;
        }
      }
      ::std::_Vector_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>::
      ~_Vector_base((_Vector_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_> *)
                    &vdst);
      ::std::_Vector_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>::
      ~_Vector_base((_Vector_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_> *)
                    &vsrc);
      break;
    case Ivec3:
      vsrc.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      vsrc.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      vsrc.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      sVar26 = VertexAttribute::vertex_count(src);
      ::std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::resize
                ((vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *)&vsrc,
                 sVar26);
      puVar12 = (src->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start;
      memcpy(vsrc.
             super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start,puVar12,
             (long)(src->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish - (long)puVar12);
      vdst.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      vdst.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      vdst.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      puVar82 = (faceVertexIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                ._M_impl.super__Vector_impl_data._M_start;
      puVar91 = (faceVertexIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                ._M_impl.super__Vector_impl_data._M_finish;
      uVar88 = (long)puVar91 - (long)puVar82 >> 2;
      bVar25 = false;
      if ((((long)vsrc.
                  super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
           (long)vsrc.
                 super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start) / 0xc == uVar88) && (2 < uVar88)) {
        puVar22 = &uStack_178;
        paVar102 = &aStack_198;
        aStack_198._M_allocated_capacity._0_4_ = 0;
        aStack_198._M_allocated_capacity._4_4_ = 0;
        aStack_198._8_8_ = 0;
        _Stack_188._M_max_load_factor = 1.0;
        _Stack_188._M_next_resize._0_4_ = 0;
        _Stack_188._M_next_resize._4_4_ = 0;
        uStack_178 = 0;
        uStack_174 = 0;
        lVar100 = 0;
        fVar99 = 0.0;
        uVar88 = 0;
        while( true ) {
          _ss_e = (uint)puVar22;
          uVar90 = (long)puVar91 - (long)puVar82 >> 2;
          if (uVar90 <= uVar88) break;
          fVar109 = (float)puVar82[uVar88];
          vidx = (uint32_t)fVar109;
          if ((uint)fVar99 < (uint)fVar109) {
            fVar99 = fVar109;
          }
          sVar64 = ::std::
                   _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::array<int,_3UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<int,_3UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::count((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::array<int,_3UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<int,_3UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                            *)&ss_e,&vidx);
          paVar97 = vsrc.
                    super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (sVar64 == 0) {
            pmVar65 = ::std::__detail::
                      _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::array<int,_3UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<int,_3UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::array<int,_3UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<int,_3UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)&ss_e,&vidx);
            *(undefined8 *)pmVar65->_M_elems = *(undefined8 *)((long)paVar97->_M_elems + lVar100);
            pmVar65->_M_elems[2] = *(int *)((long)paVar97[1]._M_elems + lVar100);
          }
          else {
            pmVar65 = ::std::__detail::
                      _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::array<int,_3UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<int,_3UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::array<int,_3UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<int,_3UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)&ss_e,&vidx);
            bVar25 = math::is_close(pmVar65,(int3 *)((long)(vsrc.
                                                  super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  _M_elems + lVar100));
            if (!bVar25) goto LAB_002972ae;
          }
          puVar22 = (undefined4 *)(ulong)_ss_e;
          uVar88 = uVar88 + 1;
          puVar82 = (local_200->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          puVar91 = (local_200->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_finish;
          lVar100 = lVar100 + 0xc;
        }
        ::std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::resize
                  ((vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *)&vdst,
                   (ulong)((int)fVar99 + 1));
        memset(vdst.
               super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start,0,(ulong)((int)fVar99 + 1) * 0xc);
        while (paVar102 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)paVar102->_M_allocated_capacity,
              paVar102 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
          lVar100 = (ulong)(uint)(&paVar102->_M_allocated_capacity)[1] * 0xc;
          *(undefined4 *)
           ((long)vdst.
                  super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + lVar100 + 8) =
               *(undefined4 *)((long)paVar102 + 0x14);
          *(undefined8 *)
           ((long)vdst.
                  super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + lVar100) =
               *(undefined8 *)(paVar102->_M_local_buf + 0xc);
        }
LAB_002972ae:
        ::std::
        _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::array<int,_3UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<int,_3UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::array<int,_3UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<int,_3UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       *)&ss_e);
        if (uVar88 < uVar90) {
          bVar25 = false;
        }
        else {
          ::std::__cxx11::string::_M_assign((string *)dst);
          dst->elementSize = 1;
          dst->format = src->format;
          dst->variability = Vertex;
          lVar100 = (long)vdst.
                          super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)vdst.
                          super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
          sVar26 = VertexAttribute::format_size(src);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data,
                     (lVar100 / 0xc) * sVar26);
          puVar12 = (dst->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          memcpy(puVar12,vdst.
                         super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                 (long)(dst->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)puVar12);
          bVar25 = true;
        }
      }
      ::std::_Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::
      ~_Vector_base((_Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *)
                    &vdst);
      ::std::_Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::
      ~_Vector_base((_Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *)
                    &vsrc);
      break;
    case Ivec4:
      vsrc.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      vsrc.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      vsrc.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      sVar26 = VertexAttribute::vertex_count(src);
      ::std::vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>::resize
                ((vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *)&vsrc,
                 sVar26);
      puVar12 = (src->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start;
      memcpy(vsrc.
             super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start,puVar12,
             (long)(src->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish - (long)puVar12);
      vdst.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      vdst.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      vdst.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      puVar82 = (faceVertexIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                ._M_impl.super__Vector_impl_data._M_start;
      puVar91 = (faceVertexIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                ._M_impl.super__Vector_impl_data._M_finish;
      uVar88 = (long)puVar91 - (long)puVar82 >> 2;
      bVar25 = false;
      if (((long)vsrc.
                 super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)vsrc.
                 super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 4 == uVar88) && (2 < uVar88)) {
        puVar22 = &uStack_178;
        paVar102 = &aStack_198;
        aStack_198._M_allocated_capacity._0_4_ = 0;
        aStack_198._M_allocated_capacity._4_4_ = 0;
        aStack_198._8_8_ = 0;
        _Stack_188._M_max_load_factor = 1.0;
        _Stack_188._M_next_resize._0_4_ = 0;
        _Stack_188._M_next_resize._4_4_ = 0;
        uStack_178 = 0;
        uStack_174 = 0;
        local_248 = 0;
        fVar99 = 0.0;
        uVar88 = 0;
        while( true ) {
          _ss_e = (uint)puVar22;
          uVar90 = (long)puVar91 - (long)puVar82 >> 2;
          if (uVar90 <= uVar88) break;
          fVar109 = (float)puVar82[uVar88];
          vidx = (uint32_t)fVar109;
          if ((uint)fVar99 < (uint)fVar109) {
            fVar99 = fVar109;
          }
          sVar78 = ::std::
                   _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::array<int,_4UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<int,_4UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::count((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::array<int,_4UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<int,_4UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                            *)&ss_e,&vidx);
          paVar97 = vsrc.
                    super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (sVar78 == 0) {
            pmVar79 = ::std::__detail::
                      _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::array<int,_4UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<int,_4UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::array<int,_4UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<int,_4UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)&ss_e,&vidx);
            puVar98 = (undefined8 *)((long)paVar97->_M_elems + local_248);
            uVar14 = puVar98[1];
            *(undefined8 *)pmVar79->_M_elems = *puVar98;
            *(undefined8 *)(pmVar79->_M_elems + 2) = uVar14;
          }
          else {
            pmVar79 = ::std::__detail::
                      _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::array<int,_4UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<int,_4UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::array<int,_4UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<int,_4UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)&ss_e,&vidx);
            bVar25 = math::is_close(pmVar79,(int4 *)((long)(vsrc.
                                                  super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  _M_elems + local_248));
            if (!bVar25) goto LAB_00297653;
          }
          puVar22 = (undefined4 *)(ulong)_ss_e;
          uVar88 = uVar88 + 1;
          puVar82 = (local_200->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          puVar91 = (local_200->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_finish;
          local_248 = local_248 + 0x10;
        }
        ::std::vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>::resize
                  ((vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *)&vdst,
                   (ulong)((int)fVar99 + 1));
        memset(vdst.
               super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start,0,(ulong)((int)fVar99 + 1) << 4);
        while (paVar102 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)paVar102->_M_allocated_capacity,
              paVar102 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
          sVar23 = (&paVar102->_M_allocated_capacity)[1];
          uVar14 = *(undefined8 *)((long)paVar102 + 0x14);
          *(undefined8 *)
           vdst.
           super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
           ._M_impl.super__Vector_impl_data._M_start[(ulong)(uint)sVar23 * 2]._M_elems =
               *(undefined8 *)(paVar102->_M_local_buf + 0xc);
          *(undefined8 *)
           (vdst.
            super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
            ._M_impl.super__Vector_impl_data._M_start + (ulong)(uint)sVar23 * 2)[1]._M_elems =
               uVar14;
        }
LAB_00297653:
        ::std::
        _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::array<int,_4UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<int,_4UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::array<int,_4UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<int,_4UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       *)&ss_e);
        if (uVar88 < uVar90) {
          bVar25 = false;
        }
        else {
          ::std::__cxx11::string::_M_assign((string *)dst);
          dst->elementSize = 1;
          dst->format = src->format;
          dst->variability = Vertex;
          lVar100 = (long)vdst.
                          super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)vdst.
                          super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
          sVar26 = VertexAttribute::format_size(src);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data,
                     (lVar100 >> 4) * sVar26);
          puVar12 = (dst->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          memcpy(puVar12,vdst.
                         super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                 (long)(dst->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)puVar12);
          bVar25 = true;
        }
      }
      ::std::_Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>::
      ~_Vector_base((_Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *)
                    &vdst);
      ::std::_Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>::
      ~_Vector_base((_Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *)
                    &vsrc);
      break;
    case Uint:
      vsrc.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      vsrc.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      vsrc.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      sVar26 = VertexAttribute::vertex_count(src);
      ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&vsrc,sVar26);
      puVar12 = (src->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start;
      memcpy(vsrc.
             super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start,puVar12,
             (long)(src->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish - (long)puVar12);
      vdst.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      vdst.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      vdst.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      puVar82 = (faceVertexIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                ._M_impl.super__Vector_impl_data._M_start;
      puVar91 = (faceVertexIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                ._M_impl.super__Vector_impl_data._M_finish;
      fVar99 = 0.0;
      if (8 < (ulong)((long)puVar91 - (long)puVar82) &&
          (long)vsrc.
                super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)vsrc.
                super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                ._M_impl.super__Vector_impl_data._M_start == (long)puVar91 - (long)puVar82) {
        puVar22 = &uStack_178;
        paVar102 = &aStack_198;
        aStack_198._M_allocated_capacity._0_4_ = 0;
        aStack_198._M_allocated_capacity._4_4_ = 0;
        aStack_198._8_8_ = 0;
        _Stack_188._M_max_load_factor = 1.0;
        _Stack_188._M_next_resize._0_4_ = 0;
        _Stack_188._M_next_resize._4_4_ = 0;
        uStack_178 = 0;
        uStack_174 = 0;
        uVar88 = 0;
        while( true ) {
          _ss_e = (uint)puVar22;
          uVar90 = (long)puVar91 - (long)puVar82 >> 2;
          if (uVar90 <= uVar88) break;
          fVar109 = (float)puVar82[uVar88];
          vidx = (uint32_t)fVar109;
          if ((uint)fVar99 < (uint)fVar109) {
            fVar99 = fVar109;
          }
          sVar76 = ::std::
                   _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::count((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                            *)&ss_e,&vidx);
          if (sVar76 == 0) {
            mVar10 = (vsrc.
                      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->_M_elems[uVar88];
            pmVar77 = ::std::__detail::
                      _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)&ss_e,&vidx);
            *pmVar77 = mVar10;
          }
          else {
            pmVar77 = ::std::__detail::
                      _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)&ss_e,&vidx);
            if (*pmVar77 !=
                (vsrc.
                 super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->_M_elems[uVar88]) goto LAB_0029751f;
          }
          puVar22 = (undefined4 *)(ulong)_ss_e;
          uVar88 = uVar88 + 1;
          puVar82 = (local_200->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          puVar91 = (local_200->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_finish;
        }
        ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&vdst,
                   (ulong)((int)fVar99 + 1));
        memset(vdst.
               super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start,0,(ulong)((int)fVar99 + 1) << 2);
        while (paVar102 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)paVar102->_M_allocated_capacity,
              paVar102 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
          (vdst.
           super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->_M_elems
          [(uint)(&paVar102->_M_allocated_capacity)[1]] = *(uint *)(paVar102->_M_local_buf + 0xc);
        }
LAB_0029751f:
        ::std::
        _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       *)&ss_e);
        if (uVar88 < uVar90) {
          fVar99 = 0.0;
        }
        else {
          ::std::__cxx11::string::_M_assign((string *)dst);
          dst->elementSize = 1;
          dst->format = src->format;
          dst->variability = Vertex;
          lVar100 = (long)vdst.
                          super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)vdst.
                          super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
          sVar26 = VertexAttribute::format_size(src);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data,
                     (lVar100 >> 2) * sVar26);
          puVar12 = (dst->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          memcpy(puVar12,vdst.
                         super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                 (long)(dst->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)puVar12);
          fVar99 = 1.4013e-45;
        }
      }
      bVar25 = SUB41(fVar99,0);
      ::std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&vdst);
      ::std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&vsrc);
      break;
    case Uvec2:
      vsrc.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      vsrc.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      vsrc.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      sVar26 = VertexAttribute::vertex_count(src);
      ::std::vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ::resize(&vsrc,sVar26);
      puVar12 = (src->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start;
      memcpy(vsrc.
             super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start,puVar12,
             (long)(src->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish - (long)puVar12);
      vdst.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      vdst.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      vdst.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      puVar82 = (faceVertexIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                ._M_impl.super__Vector_impl_data._M_start;
      puVar91 = (faceVertexIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                ._M_impl.super__Vector_impl_data._M_finish;
      uVar88 = (long)puVar91 - (long)puVar82 >> 2;
      bVar25 = false;
      if (((long)vsrc.
                 super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)vsrc.
                 super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3 == uVar88) && (2 < uVar88)) {
        puVar22 = &uStack_178;
        paVar102 = &aStack_198;
        aStack_198._M_allocated_capacity._0_4_ = 0;
        aStack_198._M_allocated_capacity._4_4_ = 0;
        aStack_198._8_8_ = 0;
        _Stack_188._M_max_load_factor = 1.0;
        _Stack_188._M_next_resize._0_4_ = 0;
        _Stack_188._M_next_resize._4_4_ = 0;
        uStack_178 = 0;
        uStack_174 = 0;
        fVar99 = 0.0;
        uVar88 = 0;
        while( true ) {
          _ss_e = (uint)puVar22;
          uVar90 = (long)puVar91 - (long)puVar82 >> 2;
          if (uVar90 <= uVar88) break;
          fVar109 = (float)puVar82[uVar88];
          vidx = (uint32_t)fVar109;
          if ((uint)fVar99 < (uint)fVar109) {
            fVar99 = fVar109;
          }
          sVar29 = ::std::
                   _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::array<unsigned_int,_2UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<unsigned_int,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::count((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::array<unsigned_int,_2UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<unsigned_int,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                            *)&ss_e,&vidx);
          paVar97 = vsrc.
                    super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (sVar29 == 0) {
            pmVar30 = ::std::__detail::
                      _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::array<unsigned_int,_2UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<unsigned_int,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::array<unsigned_int,_2UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<unsigned_int,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)&ss_e,&vidx);
            *(undefined8 *)pmVar30->_M_elems = *(undefined8 *)paVar97[uVar88]._M_elems;
          }
          else {
            pmVar30 = ::std::__detail::
                      _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::array<unsigned_int,_2UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<unsigned_int,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::array<unsigned_int,_2UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<unsigned_int,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)&ss_e,&vidx);
            iVar107 = -(uint)((int)*(undefined8 *)
                                    vsrc.
                                    super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[uVar88]._M_elems ==
                             (int)*(undefined8 *)pmVar30->_M_elems);
            iVar108 = -(uint)((int)((ulong)*(undefined8 *)
                                            vsrc.
                                            super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start[uVar88].
                                            _M_elems >> 0x20) ==
                             (int)((ulong)*(undefined8 *)pmVar30->_M_elems >> 0x20));
            auVar105._4_4_ = iVar107;
            auVar105._0_4_ = iVar107;
            auVar105._8_4_ = iVar108;
            auVar105._12_4_ = iVar108;
            iVar107 = movmskpd((int)pmVar30,auVar105);
            if (iVar107 != 3) goto LAB_002968eb;
          }
          puVar22 = (undefined4 *)(ulong)_ss_e;
          uVar88 = uVar88 + 1;
          puVar82 = (local_200->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          puVar91 = (local_200->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_finish;
        }
        ::std::
        vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>::
        resize(&vdst,(ulong)((int)fVar99 + 1));
        memset(vdst.
               super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start,0,(ulong)((int)fVar99 + 1) << 3);
        while (paVar102 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)paVar102->_M_allocated_capacity,
              paVar102 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
          *(undefined8 *)
           vdst.
           super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
           ._M_impl.super__Vector_impl_data._M_start[(uint)(&paVar102->_M_allocated_capacity)[1]].
           _M_elems = *(undefined8 *)(paVar102->_M_local_buf + 0xc);
        }
LAB_002968eb:
        ::std::
        _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::array<unsigned_int,_2UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<unsigned_int,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::array<unsigned_int,_2UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<unsigned_int,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       *)&ss_e);
        if (uVar88 < uVar90) {
          bVar25 = false;
        }
        else {
          ::std::__cxx11::string::_M_assign((string *)dst);
          dst->elementSize = 1;
          dst->format = src->format;
          dst->variability = Vertex;
          lVar100 = (long)vdst.
                          super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)vdst.
                          super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
          sVar26 = VertexAttribute::format_size(src);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data,
                     (lVar100 >> 3) * sVar26);
          puVar12 = (dst->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          memcpy(puVar12,vdst.
                         super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                 (long)(dst->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)puVar12);
          bVar25 = true;
        }
      }
      ::std::
      _Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>::
      ~_Vector_base(&vdst.
                     super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                   );
      ::std::
      _Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>::
      ~_Vector_base(&vsrc.
                     super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                   );
      break;
    case Uvec3:
      vsrc.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      vsrc.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      vsrc.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      sVar26 = VertexAttribute::vertex_count(src);
      ::std::vector<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
      ::resize((vector<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
                *)&vsrc,sVar26);
      puVar12 = (src->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start;
      memcpy(vsrc.
             super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start,puVar12,
             (long)(src->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish - (long)puVar12);
      vdst.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      vdst.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      vdst.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      puVar82 = (faceVertexIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                ._M_impl.super__Vector_impl_data._M_start;
      puVar91 = (faceVertexIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                ._M_impl.super__Vector_impl_data._M_finish;
      uVar88 = (long)puVar91 - (long)puVar82 >> 2;
      bVar25 = false;
      if ((((long)vsrc.
                  super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
           (long)vsrc.
                 super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start) / 0xc == uVar88) && (2 < uVar88)) {
        puVar22 = &uStack_178;
        paVar102 = &aStack_198;
        aStack_198._M_allocated_capacity._0_4_ = 0;
        aStack_198._M_allocated_capacity._4_4_ = 0;
        aStack_198._8_8_ = 0;
        _Stack_188._M_max_load_factor = 1.0;
        _Stack_188._M_next_resize._0_4_ = 0;
        _Stack_188._M_next_resize._4_4_ = 0;
        uStack_178 = 0;
        uStack_174 = 0;
        lVar100 = 0;
        fVar99 = 0.0;
        uVar88 = 0;
        while( true ) {
          _ss_e = (uint)puVar22;
          uVar90 = (long)puVar91 - (long)puVar82 >> 2;
          if (uVar90 <= uVar88) break;
          fVar109 = (float)puVar82[uVar88];
          vidx = (uint32_t)fVar109;
          if ((uint)fVar99 < (uint)fVar109) {
            fVar99 = fVar109;
          }
          sVar46 = ::std::
                   _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::array<unsigned_int,_3UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<unsigned_int,_3UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::count((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::array<unsigned_int,_3UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<unsigned_int,_3UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                            *)&ss_e,&vidx);
          paVar97 = vsrc.
                    super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (sVar46 == 0) {
            pmVar47 = ::std::__detail::
                      _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::array<unsigned_int,_3UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<unsigned_int,_3UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::array<unsigned_int,_3UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<unsigned_int,_3UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)&ss_e,&vidx);
            *(undefined8 *)pmVar47->_M_elems = *(undefined8 *)((long)paVar97->_M_elems + lVar100);
            pmVar47->_M_elems[2] = *(uint *)((long)paVar97[1]._M_elems + lVar100);
          }
          else {
            pmVar47 = ::std::__detail::
                      _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::array<unsigned_int,_3UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<unsigned_int,_3UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::array<unsigned_int,_3UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<unsigned_int,_3UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)&ss_e,&vidx);
            bVar25 = math::is_close(pmVar47,(uint3 *)((long)(vsrc.
                                                  super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  _M_elems + lVar100));
            if (!bVar25) goto LAB_00296dc4;
          }
          puVar22 = (undefined4 *)(ulong)_ss_e;
          uVar88 = uVar88 + 1;
          puVar82 = (local_200->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          puVar91 = (local_200->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_finish;
          lVar100 = lVar100 + 0xc;
        }
        ::std::
        vector<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>::
        resize((vector<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
                *)&vdst,(ulong)((int)fVar99 + 1));
        memset(vdst.
               super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start,0,(ulong)((int)fVar99 + 1) * 0xc);
        while (paVar102 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)paVar102->_M_allocated_capacity,
              paVar102 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
          lVar100 = (ulong)(uint)(&paVar102->_M_allocated_capacity)[1] * 0xc;
          *(undefined4 *)
           ((long)vdst.
                  super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + lVar100 + 8) =
               *(undefined4 *)((long)paVar102 + 0x14);
          *(undefined8 *)
           ((long)vdst.
                  super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + lVar100) =
               *(undefined8 *)(paVar102->_M_local_buf + 0xc);
        }
LAB_00296dc4:
        ::std::
        _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::array<unsigned_int,_3UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<unsigned_int,_3UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::array<unsigned_int,_3UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<unsigned_int,_3UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       *)&ss_e);
        if (uVar88 < uVar90) {
          bVar25 = false;
        }
        else {
          ::std::__cxx11::string::_M_assign((string *)dst);
          dst->elementSize = 1;
          dst->format = src->format;
          dst->variability = Vertex;
          lVar100 = (long)vdst.
                          super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)vdst.
                          super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
          sVar26 = VertexAttribute::format_size(src);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data,
                     (lVar100 / 0xc) * sVar26);
          puVar12 = (dst->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          memcpy(puVar12,vdst.
                         super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                 (long)(dst->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)puVar12);
          bVar25 = true;
        }
      }
      ::std::
      _Vector_base<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>::
      ~_Vector_base((_Vector_base<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
                     *)&vdst);
      ::std::
      _Vector_base<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>::
      ~_Vector_base((_Vector_base<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
                     *)&vsrc);
      break;
    case Uvec4:
      vsrc.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      vsrc.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      vsrc.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      sVar26 = VertexAttribute::vertex_count(src);
      ::std::vector<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>
      ::resize((vector<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>
                *)&vsrc,sVar26);
      puVar12 = (src->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start;
      memcpy(vsrc.
             super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start,puVar12,
             (long)(src->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish - (long)puVar12);
      vdst.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      vdst.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      vdst.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      puVar82 = (faceVertexIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                ._M_impl.super__Vector_impl_data._M_start;
      puVar91 = (faceVertexIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                ._M_impl.super__Vector_impl_data._M_finish;
      uVar88 = (long)puVar91 - (long)puVar82 >> 2;
      bVar25 = false;
      if (((long)vsrc.
                 super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)vsrc.
                 super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 4 == uVar88) && (2 < uVar88)) {
        puVar22 = &uStack_178;
        paVar102 = &aStack_198;
        aStack_198._M_allocated_capacity._0_4_ = 0;
        aStack_198._M_allocated_capacity._4_4_ = 0;
        aStack_198._8_8_ = 0;
        _Stack_188._M_max_load_factor = 1.0;
        _Stack_188._M_next_resize._0_4_ = 0;
        _Stack_188._M_next_resize._4_4_ = 0;
        uStack_178 = 0;
        uStack_174 = 0;
        local_248 = 0;
        fVar99 = 0.0;
        uVar88 = 0;
        while( true ) {
          _ss_e = (uint)puVar22;
          uVar90 = (long)puVar91 - (long)puVar82 >> 2;
          if (uVar90 <= uVar88) break;
          fVar109 = (float)puVar82[uVar88];
          vidx = (uint32_t)fVar109;
          if ((uint)fVar99 < (uint)fVar109) {
            fVar99 = fVar109;
          }
          sVar80 = ::std::
                   _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::array<unsigned_int,_4UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<unsigned_int,_4UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::count((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::array<unsigned_int,_4UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<unsigned_int,_4UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                            *)&ss_e,&vidx);
          paVar97 = vsrc.
                    super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (sVar80 == 0) {
            pmVar81 = ::std::__detail::
                      _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::array<unsigned_int,_4UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<unsigned_int,_4UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::array<unsigned_int,_4UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<unsigned_int,_4UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)&ss_e,&vidx);
            puVar98 = (undefined8 *)((long)paVar97->_M_elems + local_248);
            uVar14 = puVar98[1];
            *(undefined8 *)pmVar81->_M_elems = *puVar98;
            *(undefined8 *)(pmVar81->_M_elems + 2) = uVar14;
          }
          else {
            pmVar81 = ::std::__detail::
                      _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::array<unsigned_int,_4UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<unsigned_int,_4UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::array<unsigned_int,_4UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<unsigned_int,_4UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)&ss_e,&vidx);
            bVar25 = math::is_close(pmVar81,(uint4 *)((long)(vsrc.
                                                  super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  _M_elems + local_248));
            if (!bVar25) goto LAB_002976ed;
          }
          puVar22 = (undefined4 *)(ulong)_ss_e;
          uVar88 = uVar88 + 1;
          puVar82 = (local_200->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          puVar91 = (local_200->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_finish;
          local_248 = local_248 + 0x10;
        }
        ::std::
        vector<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>::
        resize((vector<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>
                *)&vdst,(ulong)((int)fVar99 + 1));
        memset(vdst.
               super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start,0,(ulong)((int)fVar99 + 1) << 4);
        while (paVar102 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)paVar102->_M_allocated_capacity,
              paVar102 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
          sVar23 = (&paVar102->_M_allocated_capacity)[1];
          uVar14 = *(undefined8 *)((long)paVar102 + 0x14);
          *(undefined8 *)
           vdst.
           super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
           ._M_impl.super__Vector_impl_data._M_start[(ulong)(uint)sVar23 * 2]._M_elems =
               *(undefined8 *)(paVar102->_M_local_buf + 0xc);
          *(undefined8 *)
           (vdst.
            super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
            ._M_impl.super__Vector_impl_data._M_start + (ulong)(uint)sVar23 * 2)[1]._M_elems =
               uVar14;
        }
LAB_002976ed:
        ::std::
        _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::array<unsigned_int,_4UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<unsigned_int,_4UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::array<unsigned_int,_4UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<unsigned_int,_4UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       *)&ss_e);
        if (uVar88 < uVar90) {
          bVar25 = false;
        }
        else {
          ::std::__cxx11::string::_M_assign((string *)dst);
          dst->elementSize = 1;
          dst->format = src->format;
          dst->variability = Vertex;
          lVar100 = (long)vdst.
                          super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)vdst.
                          super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
          sVar26 = VertexAttribute::format_size(src);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data,
                     (lVar100 >> 4) * sVar26);
          puVar12 = (dst->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          memcpy(puVar12,vdst.
                         super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                 (long)(dst->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)puVar12);
          bVar25 = true;
        }
      }
      ::std::
      _Vector_base<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>::
      ~_Vector_base((_Vector_base<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>
                     *)&vdst);
      ::std::
      _Vector_base<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>::
      ~_Vector_base((_Vector_base<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>
                     *)&vsrc);
      break;
    case Double:
      vsrc.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      vsrc.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      vsrc.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      sVar26 = VertexAttribute::vertex_count(src);
      ::std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)&vsrc,sVar26);
      puVar12 = (src->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start;
      memcpy(vsrc.
             super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start,puVar12,
             (long)(src->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish - (long)puVar12);
      vdst.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      vdst.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      vdst.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      puVar82 = (faceVertexIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                ._M_impl.super__Vector_impl_data._M_start;
      puVar91 = (faceVertexIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                ._M_impl.super__Vector_impl_data._M_finish;
      uVar88 = (long)puVar91 - (long)puVar82 >> 2;
      bVar25 = false;
      if (((long)vsrc.
                 super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)vsrc.
                 super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3 == uVar88) && (2 < uVar88)) {
        puVar22 = &uStack_178;
        paVar102 = &aStack_198;
        aStack_198._M_allocated_capacity._0_4_ = 0;
        aStack_198._M_allocated_capacity._4_4_ = 0;
        aStack_198._8_8_ = 0;
        _Stack_188._M_max_load_factor = 1.0;
        _Stack_188._M_next_resize._0_4_ = 0;
        _Stack_188._M_next_resize._4_4_ = 0;
        uStack_178 = 0;
        uStack_174 = 0;
        fVar99 = 0.0;
        uVar88 = 0;
        while( true ) {
          _ss_e = (uint)puVar22;
          uVar90 = (long)puVar91 - (long)puVar82 >> 2;
          if (uVar90 <= uVar88) break;
          fVar109 = (float)puVar82[uVar88];
          vidx = (uint32_t)fVar109;
          if ((uint)fVar99 < (uint)fVar109) {
            fVar99 = fVar109;
          }
          sVar31 = ::std::
                   _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_double>,_std::allocator<std::pair<const_unsigned_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::count((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_double>,_std::allocator<std::pair<const_unsigned_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                            *)&ss_e,&vidx);
          if (sVar31 == 0) {
            local_1f8._0_8_ =
                 *(undefined8 *)
                  vsrc.
                  super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar88]._M_elems;
            pmVar32 = ::std::__detail::
                      _Map_base<unsigned_int,_std::pair<const_unsigned_int,_double>,_std::allocator<std::pair<const_unsigned_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_double>,_std::allocator<std::pair<const_unsigned_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)&ss_e,&vidx);
            *pmVar32 = (mapped_type)local_1f8._0_8_;
          }
          else {
            pmVar32 = ::std::__detail::
                      _Map_base<unsigned_int,_std::pair<const_unsigned_int,_double>,_std::allocator<std::pair<const_unsigned_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_double>,_std::allocator<std::pair<const_unsigned_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)&ss_e,&vidx);
            dVar104 = ABS(*pmVar32 -
                          *(double *)
                           vsrc.
                           super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar88]._M_elems);
            if ((double)eps < dVar104) {
              local_1f8._8_8_ = 0;
              local_1f8._0_8_ = dVar104;
              dVar104 = fmax(ABS(*pmVar32),
                             ABS(*(double *)
                                  vsrc.
                                  super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[uVar88]._M_elems));
              if (dVar104 * (double)eps < (double)local_1f8._0_8_) goto LAB_002978c4;
            }
          }
          puVar22 = (undefined4 *)(ulong)_ss_e;
          uVar88 = uVar88 + 1;
          puVar82 = (local_200->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          puVar91 = (local_200->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_finish;
        }
        ::std::vector<double,_std::allocator<double>_>::resize
                  ((vector<double,_std::allocator<double>_> *)&vdst,(ulong)((int)fVar99 + 1));
        memset(vdst.
               super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start,0,(ulong)((int)fVar99 + 1) << 3);
        while (paVar102 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)paVar102->_M_allocated_capacity,
              paVar102 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
          *(size_type *)
           vdst.
           super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
           ._M_impl.super__Vector_impl_data._M_start[(uint)(&paVar102->_M_allocated_capacity)[1]].
           _M_elems = (&paVar102->_M_allocated_capacity)[2];
        }
LAB_002978c4:
        ::std::
        _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_double>,_std::allocator<std::pair<const_unsigned_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_double>,_std::allocator<std::pair<const_unsigned_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       *)&ss_e);
        if (uVar88 < uVar90) {
          bVar25 = false;
        }
        else {
          ::std::__cxx11::string::_M_assign((string *)dst);
          dst->elementSize = 1;
          dst->format = src->format;
          dst->variability = Vertex;
          lVar100 = (long)vdst.
                          super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)vdst.
                          super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
          sVar26 = VertexAttribute::format_size(src);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data,
                     (lVar100 >> 3) * sVar26);
          puVar12 = (dst->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          memcpy(puVar12,vdst.
                         super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                 (long)(dst->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)puVar12);
          bVar25 = true;
        }
      }
      ::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                ((_Vector_base<double,_std::allocator<double>_> *)&vdst);
      ::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                ((_Vector_base<double,_std::allocator<double>_> *)&vsrc);
      break;
    case Dvec2:
      vsrc.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      vsrc.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      vsrc.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      sVar26 = VertexAttribute::vertex_count(src);
      ::std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::resize
                ((vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *)&vsrc
                 ,sVar26);
      puVar12 = (src->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start;
      memcpy(vsrc.
             super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start,puVar12,
             (long)(src->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish - (long)puVar12);
      vdst.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      vdst.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      vdst.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      puVar82 = (faceVertexIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                ._M_impl.super__Vector_impl_data._M_start;
      puVar91 = (faceVertexIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                ._M_impl.super__Vector_impl_data._M_finish;
      uVar88 = (long)puVar91 - (long)puVar82 >> 2;
      bVar25 = false;
      if (((long)vsrc.
                 super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)vsrc.
                 super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 4 == uVar88) && (2 < uVar88)) {
        local_1f8._0_8_ = (double)eps;
        puVar22 = &uStack_178;
        paVar102 = &aStack_198;
        aStack_198._M_allocated_capacity._0_4_ = 0;
        aStack_198._M_allocated_capacity._4_4_ = 0;
        aStack_198._8_8_ = 0;
        _Stack_188._M_max_load_factor = 1.0;
        _Stack_188._M_next_resize._0_4_ = 0;
        _Stack_188._M_next_resize._4_4_ = 0;
        uStack_178 = 0;
        uStack_174 = 0;
        local_248 = 0;
        fVar99 = 0.0;
        uVar88 = 0;
        while( true ) {
          _ss_e = (uint)puVar22;
          uVar90 = (long)puVar91 - (long)puVar82 >> 2;
          if (uVar90 <= uVar88) break;
          fVar109 = (float)puVar82[uVar88];
          vidx = (uint32_t)fVar109;
          if ((uint)fVar99 < (uint)fVar109) {
            fVar99 = fVar109;
          }
          sVar42 = ::std::
                   _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::array<double,_2UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<double,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::count((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::array<double,_2UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<double,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                            *)&ss_e,&vidx);
          paVar97 = vsrc.
                    super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (sVar42 == 0) {
            pmVar43 = ::std::__detail::
                      _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::array<double,_2UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<double,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::array<double,_2UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<double,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)&ss_e,&vidx);
            pdVar96 = (double *)((long)paVar97->_M_elems + local_248);
            dVar104 = pdVar96[1];
            pmVar43->_M_elems[0] = *pdVar96;
            pmVar43->_M_elems[1] = dVar104;
          }
          else {
            pmVar43 = ::std::__detail::
                      _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::array<double,_2UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<double,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::array<double,_2UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<double,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)&ss_e,&vidx);
            bVar25 = math::is_close(pmVar43,(double2 *)
                                            ((long)(vsrc.
                                                  super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  _M_elems + local_248),(double)local_1f8._0_8_);
            if (!bVar25) goto LAB_00296c90;
          }
          puVar22 = (undefined4 *)(ulong)_ss_e;
          uVar88 = uVar88 + 1;
          puVar82 = (local_200->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          puVar91 = (local_200->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_finish;
          local_248 = local_248 + 0x10;
        }
        ::std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::resize
                  ((vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *)
                   &vdst,(ulong)((int)fVar99 + 1));
        memset(vdst.
               super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start,0,(ulong)((int)fVar99 + 1) << 4);
        while (paVar102 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)paVar102->_M_allocated_capacity,
              paVar102 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
          sVar24 = (&paVar102->_M_allocated_capacity)[1];
          sVar23 = (&paVar102->_M_allocated_capacity)[3];
          *(size_type *)
           vdst.
           super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
           ._M_impl.super__Vector_impl_data._M_start[(ulong)(uint)sVar24 * 2]._M_elems =
               (&paVar102->_M_allocated_capacity)[2];
          *(size_type *)
           (vdst.
            super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
            ._M_impl.super__Vector_impl_data._M_start + (ulong)(uint)sVar24 * 2)[1]._M_elems =
               sVar23;
        }
LAB_00296c90:
        ::std::
        _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::array<double,_2UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<double,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::array<double,_2UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<double,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       *)&ss_e);
        if (uVar88 < uVar90) {
          bVar25 = false;
        }
        else {
          ::std::__cxx11::string::_M_assign((string *)dst);
          dst->elementSize = 1;
          dst->format = src->format;
          dst->variability = Vertex;
          lVar100 = (long)vdst.
                          super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)vdst.
                          super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
          sVar26 = VertexAttribute::format_size(src);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data,
                     (lVar100 >> 4) * sVar26);
          puVar12 = (dst->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          memcpy(puVar12,vdst.
                         super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                 (long)(dst->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)puVar12);
          bVar25 = true;
        }
      }
      ::std::_Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::
      ~_Vector_base((_Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                     *)&vdst);
      ::std::_Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::
      ~_Vector_base((_Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                     *)&vsrc);
      break;
    case Dvec3:
      vsrc.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      vsrc.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      vsrc.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      sVar26 = VertexAttribute::vertex_count(src);
      ::std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>::resize
                ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)&vsrc
                 ,sVar26);
      puVar12 = (src->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start;
      memcpy(vsrc.
             super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start,puVar12,
             (long)(src->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish - (long)puVar12);
      vdst.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      vdst.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      vdst.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      puVar82 = (faceVertexIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                ._M_impl.super__Vector_impl_data._M_start;
      puVar91 = (faceVertexIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                ._M_impl.super__Vector_impl_data._M_finish;
      uVar88 = (long)puVar91 - (long)puVar82 >> 2;
      bVar25 = false;
      if ((((long)vsrc.
                  super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
           (long)vsrc.
                 super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start) / 0x18 == uVar88) && (2 < uVar88)) {
        local_1f8._0_8_ = (double)eps;
        puVar22 = &uStack_178;
        paVar102 = &aStack_198;
        aStack_198._M_allocated_capacity._0_4_ = 0;
        aStack_198._M_allocated_capacity._4_4_ = 0;
        aStack_198._8_8_ = 0;
        _Stack_188._M_max_load_factor = 1.0;
        _Stack_188._M_next_resize._0_4_ = 0;
        _Stack_188._M_next_resize._4_4_ = 0;
        uStack_178 = 0;
        uStack_174 = 0;
        lVar100 = 0;
        fVar99 = 0.0;
        uVar88 = 0;
        while( true ) {
          _ss_e = (uint)puVar22;
          uVar90 = (long)puVar91 - (long)puVar82 >> 2;
          if (uVar90 <= uVar88) break;
          fVar109 = (float)puVar82[uVar88];
          vidx = (uint32_t)fVar109;
          if ((uint)fVar99 < (uint)fVar109) {
            fVar99 = fVar109;
          }
          sVar36 = ::std::
                   _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::array<double,_3UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<double,_3UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::count((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::array<double,_3UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<double,_3UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                            *)&ss_e,&vidx);
          paVar97 = vsrc.
                    super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (sVar36 == 0) {
            pmVar37 = ::std::__detail::
                      _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::array<double,_3UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<double,_3UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::array<double,_3UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<double,_3UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)&ss_e,&vidx);
            pdVar96 = (double *)((long)paVar97->_M_elems + lVar100);
            dVar104 = pdVar96[1];
            pmVar37->_M_elems[0] = *pdVar96;
            pmVar37->_M_elems[1] = dVar104;
            pmVar37->_M_elems[2] = *(double *)((long)paVar97[2]._M_elems + lVar100);
          }
          else {
            pmVar37 = ::std::__detail::
                      _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::array<double,_3UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<double,_3UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::array<double,_3UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<double,_3UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)&ss_e,&vidx);
            bVar25 = math::is_close(pmVar37,(double3 *)
                                            ((long)(vsrc.
                                                  super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  _M_elems + lVar100),(double)local_1f8._0_8_);
            if (!bVar25) goto LAB_00296ab9;
          }
          puVar22 = (undefined4 *)(ulong)_ss_e;
          uVar88 = uVar88 + 1;
          puVar82 = (local_200->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          puVar91 = (local_200->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_finish;
          lVar100 = lVar100 + 0x18;
        }
        ::std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>::resize
                  ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
                   &vdst,(ulong)((int)fVar99 + 1));
        memset(vdst.
               super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start,0,(ulong)((int)fVar99 + 1) * 0x18);
        while (paVar102 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)paVar102->_M_allocated_capacity,
              paVar102 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
          sVar24 = (&paVar102->_M_allocated_capacity)[1];
          *(size_type *)
           vdst.
           super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
           ._M_impl.super__Vector_impl_data._M_start[(ulong)(uint)sVar24 * 3 + 2]._M_elems =
               (&paVar102->_M_allocated_capacity)[4];
          sVar23 = (&paVar102->_M_allocated_capacity)[3];
          *(size_type *)
           vdst.
           super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
           ._M_impl.super__Vector_impl_data._M_start[(ulong)(uint)sVar24 * 3]._M_elems =
               (&paVar102->_M_allocated_capacity)[2];
          *(size_type *)
           (vdst.
            super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
            ._M_impl.super__Vector_impl_data._M_start + (ulong)(uint)sVar24 * 3)[1]._M_elems =
               sVar23;
        }
LAB_00296ab9:
        ::std::
        _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::array<double,_3UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<double,_3UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::array<double,_3UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<double,_3UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       *)&ss_e);
        if (uVar88 < uVar90) {
          bVar25 = false;
        }
        else {
          ::std::__cxx11::string::_M_assign((string *)dst);
          dst->elementSize = 1;
          dst->format = src->format;
          dst->variability = Vertex;
          lVar100 = (long)vdst.
                          super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)vdst.
                          super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
          sVar26 = VertexAttribute::format_size(src);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data,
                     (lVar100 / 0x18) * sVar26);
          puVar12 = (dst->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          memcpy(puVar12,vdst.
                         super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                 (long)(dst->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)puVar12);
          bVar25 = true;
        }
      }
      ::std::_Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>::
      ~_Vector_base((_Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                     *)&vdst);
      ::std::_Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>::
      ~_Vector_base((_Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                     *)&vsrc);
      break;
    case Dvec4:
      vsrc.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      vsrc.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      vsrc.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      sVar26 = VertexAttribute::vertex_count(src);
      ::std::vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>::resize
                ((vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> *)&vsrc
                 ,sVar26);
      puVar12 = (src->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start;
      memcpy(vsrc.
             super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start,puVar12,
             (long)(src->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish - (long)puVar12);
      vdst.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      vdst.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      vdst.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      puVar82 = (faceVertexIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                ._M_impl.super__Vector_impl_data._M_start;
      puVar91 = (faceVertexIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                ._M_impl.super__Vector_impl_data._M_finish;
      uVar88 = (long)puVar91 - (long)puVar82 >> 2;
      bVar25 = false;
      if (((long)vsrc.
                 super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)vsrc.
                 super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 5 == uVar88) && (2 < uVar88)) {
        local_1f8._0_8_ = (double)eps;
        puVar22 = &uStack_178;
        paVar102 = &aStack_198;
        aStack_198._M_allocated_capacity._0_4_ = 0;
        aStack_198._M_allocated_capacity._4_4_ = 0;
        aStack_198._8_8_ = 0;
        _Stack_188._M_max_load_factor = 1.0;
        _Stack_188._M_next_resize._0_4_ = 0;
        _Stack_188._M_next_resize._4_4_ = 0;
        uStack_178 = 0;
        uStack_174 = 0;
        lVar100 = 0;
        fVar99 = 0.0;
        uVar88 = 0;
        while( true ) {
          _ss_e = (uint)puVar22;
          uVar90 = (long)puVar91 - (long)puVar82 >> 2;
          if (uVar90 <= uVar88) break;
          fVar109 = (float)puVar82[uVar88];
          vidx = (uint32_t)fVar109;
          if ((uint)fVar99 < (uint)fVar109) {
            fVar99 = fVar109;
          }
          sVar56 = ::std::
                   _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::array<double,_4UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<double,_4UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::count((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::array<double,_4UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<double,_4UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                            *)&ss_e,&vidx);
          paVar97 = vsrc.
                    super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (sVar56 == 0) {
            pmVar57 = ::std::__detail::
                      _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::array<double,_4UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<double,_4UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::array<double,_4UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<double,_4UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)&ss_e,&vidx);
            pdVar96 = (double *)((long)paVar97->_M_elems + lVar100);
            dVar104 = pdVar96[1];
            auVar105 = *(undefined1 (*) [16])((long)paVar97[2]._M_elems + lVar100);
            pmVar57->_M_elems[0] = *pdVar96;
            pmVar57->_M_elems[1] = dVar104;
            *(undefined1 (*) [16])(pmVar57->_M_elems + 2) = auVar105;
          }
          else {
            pmVar57 = ::std::__detail::
                      _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::array<double,_4UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<double,_4UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::array<double,_4UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<double,_4UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)&ss_e,&vidx);
            bVar25 = math::is_close(pmVar57,(double4 *)
                                            ((long)(vsrc.
                                                  super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  _M_elems + lVar100),(double)local_1f8._0_8_);
            if (!bVar25) goto LAB_00297039;
          }
          puVar22 = (undefined4 *)(ulong)_ss_e;
          uVar88 = uVar88 + 1;
          puVar82 = (local_200->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          puVar91 = (local_200->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_finish;
          lVar100 = lVar100 + 0x20;
        }
        ::std::vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>::resize
                  ((vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> *)
                   &vdst,(ulong)((int)fVar99 + 1));
        memset(vdst.
               super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start,0,(ulong)((int)fVar99 + 1) << 5);
        while (paVar102 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)paVar102->_M_allocated_capacity,
              paVar102 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
          sVar24 = (&paVar102->_M_allocated_capacity)[1];
          sVar23 = (&paVar102->_M_allocated_capacity)[5];
          *(size_type *)
           vdst.
           super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
           ._M_impl.super__Vector_impl_data._M_start[(ulong)(uint)sVar24 * 4 + 2]._M_elems =
               (&paVar102->_M_allocated_capacity)[4];
          *(size_type *)
           (vdst.
            super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
            ._M_impl.super__Vector_impl_data._M_start + (ulong)(uint)sVar24 * 4 + 2)[1]._M_elems =
               sVar23;
          sVar23 = (&paVar102->_M_allocated_capacity)[3];
          *(size_type *)
           vdst.
           super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
           ._M_impl.super__Vector_impl_data._M_start[(ulong)(uint)sVar24 * 4]._M_elems =
               (&paVar102->_M_allocated_capacity)[2];
          *(size_type *)
           (vdst.
            super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
            ._M_impl.super__Vector_impl_data._M_start + (ulong)(uint)sVar24 * 4)[1]._M_elems =
               sVar23;
        }
LAB_00297039:
        ::std::
        _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::array<double,_4UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<double,_4UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::array<double,_4UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<double,_4UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       *)&ss_e);
        if (uVar88 < uVar90) {
          bVar25 = false;
        }
        else {
          ::std::__cxx11::string::_M_assign((string *)dst);
          dst->elementSize = 1;
          dst->format = src->format;
          dst->variability = Vertex;
          lVar100 = (long)vdst.
                          super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)vdst.
                          super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
          sVar26 = VertexAttribute::format_size(src);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data,
                     (lVar100 >> 5) * sVar26);
          puVar12 = (dst->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          memcpy(puVar12,vdst.
                         super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                 (long)(dst->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)puVar12);
          bVar25 = true;
        }
      }
      ::std::_Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>::
      ~_Vector_base((_Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
                     *)&vdst);
      ::std::_Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>::
      ~_Vector_base((_Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
                     *)&vsrc);
      break;
    case Mat2:
      vsrc.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      vsrc.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      vsrc.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      sVar26 = VertexAttribute::vertex_count(src);
      ::std::vector<tinyusdz::value::matrix2f,_std::allocator<tinyusdz::value::matrix2f>_>::resize
                ((vector<tinyusdz::value::matrix2f,_std::allocator<tinyusdz::value::matrix2f>_> *)
                 &vsrc,sVar26);
      puVar12 = (src->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start;
      memcpy(vsrc.
             super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start,puVar12,
             (long)(src->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish - (long)puVar12);
      vdst.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      vdst.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      vdst.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      puVar82 = (faceVertexIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                ._M_impl.super__Vector_impl_data._M_start;
      puVar91 = (faceVertexIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                ._M_impl.super__Vector_impl_data._M_finish;
      uVar88 = (long)puVar91 - (long)puVar82 >> 2;
      bVar25 = false;
      if (((long)vsrc.
                 super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)vsrc.
                 super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 4 == uVar88) && (2 < uVar88)) {
        puVar22 = &uStack_178;
        paVar102 = &aStack_198;
        aStack_198._M_allocated_capacity._0_4_ = 0;
        aStack_198._M_allocated_capacity._4_4_ = 0;
        aStack_198._8_8_ = 0;
        _Stack_188._M_max_load_factor = 1.0;
        _Stack_188._M_next_resize._0_4_ = 0;
        _Stack_188._M_next_resize._4_4_ = 0;
        uStack_178 = 0;
        uStack_174 = 0;
        local_248 = 0;
        fVar99 = 0.0;
        uVar88 = 0;
        while( true ) {
          _ss_e = (uint)puVar22;
          uVar90 = (long)puVar91 - (long)puVar82 >> 2;
          if (uVar90 <= uVar88) break;
          fVar109 = (float)puVar82[uVar88];
          vidx = (uint32_t)fVar109;
          if ((uint)fVar99 < (uint)fVar109) {
            fVar99 = fVar109;
          }
          sVar34 = ::std::
                   _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::value::matrix2f>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::value::matrix2f>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::count((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::value::matrix2f>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::value::matrix2f>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                            *)&ss_e,&vidx);
          paVar97 = vsrc.
                    super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (sVar34 == 0) {
            pmVar35 = ::std::__detail::
                      _Map_base<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::value::matrix2f>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::value::matrix2f>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::value::matrix2f>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::value::matrix2f>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)&ss_e,&vidx);
            pafVar1 = (float (*) [2])((long)paVar97->_M_elems + local_248);
            afVar13 = pafVar1[1];
            pmVar35->m[0] = *pafVar1;
            pmVar35->m[1] = afVar13;
          }
          else {
            pmVar35 = ::std::__detail::
                      _Map_base<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::value::matrix2f>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::value::matrix2f>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::value::matrix2f>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::value::matrix2f>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)&ss_e,&vidx);
            bVar25 = tinyusdz::is_close(pmVar35,(matrix2f *)
                                                ((long)(vsrc.
                                                  super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  _M_elems + local_248),1.1920929e-07);
            if (!bVar25) goto LAB_00296a1f;
          }
          puVar22 = (undefined4 *)(ulong)_ss_e;
          uVar88 = uVar88 + 1;
          puVar82 = (local_200->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          puVar91 = (local_200->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_finish;
          local_248 = local_248 + 0x10;
        }
        vidx = 0x3f800000;
        fStack_214 = 0.0;
        afStack_210[0] = 0.0;
        afStack_210[1] = 1.0;
        ::std::vector<tinyusdz::value::matrix2f,_std::allocator<tinyusdz::value::matrix2f>_>::
        _M_fill_assign((vector<tinyusdz::value::matrix2f,_std::allocator<tinyusdz::value::matrix2f>_>
                        *)&vdst,(ulong)((int)fVar99 + 1),(value_type *)&vidx);
        while (paVar102 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)paVar102->_M_allocated_capacity,
              paVar102 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
          sVar23 = (&paVar102->_M_allocated_capacity)[1];
          uVar14 = *(undefined8 *)((long)paVar102 + 0x14);
          *(undefined8 *)
           vdst.
           super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
           ._M_impl.super__Vector_impl_data._M_start[(ulong)(uint)sVar23 * 2]._M_elems =
               *(undefined8 *)(paVar102->_M_local_buf + 0xc);
          *(undefined8 *)
           (vdst.
            super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
            ._M_impl.super__Vector_impl_data._M_start + (ulong)(uint)sVar23 * 2)[1]._M_elems =
               uVar14;
        }
LAB_00296a1f:
        ::std::
        _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::value::matrix2f>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::value::matrix2f>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::value::matrix2f>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::value::matrix2f>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       *)&ss_e);
        if (uVar88 < uVar90) {
          bVar25 = false;
        }
        else {
          ::std::__cxx11::string::_M_assign((string *)dst);
          dst->elementSize = 1;
          dst->format = src->format;
          dst->variability = Vertex;
          lVar100 = (long)vdst.
                          super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)vdst.
                          super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
          sVar26 = VertexAttribute::format_size(src);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data,
                     (lVar100 >> 4) * sVar26);
          puVar12 = (dst->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          memcpy(puVar12,vdst.
                         super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                 (long)(dst->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)puVar12);
          bVar25 = true;
        }
      }
      ::std::_Vector_base<tinyusdz::value::matrix2f,_std::allocator<tinyusdz::value::matrix2f>_>::
      ~_Vector_base((_Vector_base<tinyusdz::value::matrix2f,_std::allocator<tinyusdz::value::matrix2f>_>
                     *)&vdst);
      ::std::_Vector_base<tinyusdz::value::matrix2f,_std::allocator<tinyusdz::value::matrix2f>_>::
      ~_Vector_base((_Vector_base<tinyusdz::value::matrix2f,_std::allocator<tinyusdz::value::matrix2f>_>
                     *)&vsrc);
      break;
    case Mat3:
      vdst.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      vdst.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      vdst.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      sVar26 = VertexAttribute::vertex_count(src);
      ::std::vector<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_>::resize
                ((vector<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_> *)
                 &vdst,sVar26);
      puVar12 = (src->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start;
      memcpy(vdst.
             super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start,puVar12,
             (long)(src->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish - (long)puVar12);
      local_208 = (pointer)0x0;
      vidx = 0;
      fStack_214 = 0.0;
      afStack_210[0] = 0.0;
      afStack_210[1] = 0.0;
      puVar82 = (faceVertexIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                ._M_impl.super__Vector_impl_data._M_start;
      puVar91 = (faceVertexIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                ._M_impl.super__Vector_impl_data._M_finish;
      uVar88 = (long)puVar91 - (long)puVar82 >> 2;
      bVar25 = false;
      if ((((long)vdst.
                  super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
           (long)vdst.
                 super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start) / 0x24 == uVar88) && (2 < uVar88)) {
        puVar22 = &uStack_178;
        paVar102 = &aStack_198;
        aStack_198._M_allocated_capacity._0_4_ = 0;
        aStack_198._M_allocated_capacity._4_4_ = 0;
        aStack_198._8_8_ = 0;
        _Stack_188._M_max_load_factor = 1.0;
        _Stack_188._M_next_resize._0_4_ = 0;
        _Stack_188._M_next_resize._4_4_ = 0;
        uStack_178 = 0;
        uStack_174 = 0;
        lVar100 = 0;
        uVar93 = 0;
        uVar88 = 0;
        while( true ) {
          _ss_e = (uint)puVar22;
          uVar90 = (long)puVar91 - (long)puVar82 >> 2;
          if (uVar90 <= uVar88) break;
          uVar9 = puVar82[uVar88];
          vsrc.
          super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)CONCAT44(vsrc.
                                 super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start._4_4_,uVar9);
          if (uVar93 < uVar9) {
            uVar93 = uVar9;
          }
          sVar85 = ::std::
                   _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::value::matrix3f>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::value::matrix3f>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::count((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::value::matrix3f>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::value::matrix3f>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                            *)&ss_e,(key_type_conflict1 *)&vsrc);
          paVar97 = vdst.
                    super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (sVar85 == 0) {
            pmVar86 = ::std::__detail::
                      _Map_base<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::value::matrix3f>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::value::matrix3f>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::value::matrix3f>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::value::matrix3f>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)&ss_e,(key_type *)&vsrc);
            puVar98 = (undefined8 *)((long)paVar97->_M_elems + lVar100);
            uVar14 = puVar98[1];
            auVar105 = *(undefined1 (*) [16])((long)paVar97[2]._M_elems + lVar100);
            *(undefined8 *)pmVar86->m[0] = *puVar98;
            *(undefined8 *)(pmVar86->m[0] + 2) = uVar14;
            *(undefined1 (*) [16])(pmVar86->m[1] + 1) = auVar105;
            pmVar86->m[2][2] = *(float *)((long)paVar97[4]._M_elems + lVar100);
          }
          else {
            pmVar86 = ::std::__detail::
                      _Map_base<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::value::matrix3f>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::value::matrix3f>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::value::matrix3f>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::value::matrix3f>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)&ss_e,(key_type *)&vsrc);
            bVar25 = tinyusdz::is_close(pmVar86,(matrix3f *)
                                                ((long)(vdst.
                                                  super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  _M_elems + lVar100),1.1920929e-07);
            if (!bVar25) goto LAB_00297823;
          }
          puVar22 = (undefined4 *)(ulong)_ss_e;
          uVar88 = uVar88 + 1;
          puVar82 = (local_200->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          puVar91 = (local_200->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_finish;
          lVar100 = lVar100 + 0x24;
        }
        tinyusdz::value::matrix3f::identity();
        ::std::vector<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_>::
        _M_fill_assign((vector<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_>
                        *)&vidx,(ulong)(uVar93 + 1),(value_type *)&vsrc);
        while (paVar102 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)paVar102->_M_allocated_capacity,
              paVar102 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
          lVar100 = (ulong)(uint)(&paVar102->_M_allocated_capacity)[1] * 0x24;
          *(undefined4 *)((long)_vidx + 0x20 + lVar100) = *(undefined4 *)((long)paVar102 + 0x2c);
          uVar14 = *(undefined8 *)((long)paVar102 + 0x24);
          puVar98 = (undefined8 *)((long)_vidx + 0x10 + lVar100);
          *puVar98 = *(undefined8 *)((long)paVar102 + 0x1c);
          puVar98[1] = uVar14;
          uVar14 = *(undefined8 *)((long)paVar102 + 0x14);
          *(undefined8 *)((long)_vidx + lVar100) = *(undefined8 *)(paVar102->_M_local_buf + 0xc);
          ((undefined8 *)((long)_vidx + lVar100))[1] = uVar14;
        }
LAB_00297823:
        ::std::
        _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::value::matrix3f>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::value::matrix3f>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::value::matrix3f>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::value::matrix3f>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       *)&ss_e);
        if (uVar88 < uVar90) {
          bVar25 = false;
        }
        else {
          ::std::__cxx11::string::_M_assign((string *)dst);
          dst->elementSize = 1;
          dst->format = src->format;
          dst->variability = Vertex;
          lVar100 = (long)afStack_210 - (long)_vidx;
          sVar26 = VertexAttribute::format_size(src);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data,
                     (lVar100 / 0x24) * sVar26);
          puVar12 = (dst->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          memcpy(puVar12,(void *)_vidx,
                 (long)(dst->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)puVar12);
          bVar25 = true;
        }
      }
      ::std::_Vector_base<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_>::
      ~_Vector_base((_Vector_base<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_>
                     *)&vidx);
      ::std::_Vector_base<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_>::
      ~_Vector_base((_Vector_base<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_>
                     *)&vdst);
      break;
    case Mat4:
      vdst.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      vdst.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      vdst.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      sVar26 = VertexAttribute::vertex_count(src);
      ::std::vector<tinyusdz::value::matrix4f,_std::allocator<tinyusdz::value::matrix4f>_>::resize
                ((vector<tinyusdz::value::matrix4f,_std::allocator<tinyusdz::value::matrix4f>_> *)
                 &vdst,sVar26);
      puVar12 = (src->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start;
      memcpy(vdst.
             super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start,puVar12,
             (long)(src->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish - (long)puVar12);
      local_208 = (pointer)0x0;
      vidx = 0;
      fStack_214 = 0.0;
      afStack_210[0] = 0.0;
      afStack_210[1] = 0.0;
      puVar82 = (faceVertexIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                ._M_impl.super__Vector_impl_data._M_start;
      puVar91 = (faceVertexIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                ._M_impl.super__Vector_impl_data._M_finish;
      uVar88 = (long)puVar91 - (long)puVar82 >> 2;
      bVar25 = false;
      if (((long)vdst.
                 super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)vdst.
                 super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 6 == uVar88) && (2 < uVar88)) {
        vsrc.
        super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
        ._M_impl.super__Vector_impl_data._M_start = aaStack_1b8;
        vsrc.
        super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x1;
        ppaVar92 = &vsrc.
                    super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
        vsrc.
        super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        aaStack_1b8[0]._M_elems[0] = 0;
        aaStack_1b8[0]._M_elems[1] = 0;
        lVar100 = 0;
        uVar90 = 0;
        uVar88 = 0;
        while( true ) {
          uVar101 = (long)puVar91 - (long)puVar82 >> 2;
          if (uVar101 <= uVar90) break;
          _ss_e = puVar82[uVar90];
          uVar95 = uVar88 & 0xffffffff;
          if ((uint)uVar88 < _ss_e) {
            uVar95 = (ulong)_ss_e;
          }
          local_1f8._0_8_ = uVar95;
          sVar83 = ::std::
                   _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::value::matrix4f>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::value::matrix4f>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::count((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::value::matrix4f>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::value::matrix4f>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                            *)&vsrc,(key_type_conflict1 *)&ss_e);
          paVar97 = vdst.
                    super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (sVar83 == 0) {
            pmVar84 = ::std::__detail::
                      _Map_base<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::value::matrix4f>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::value::matrix4f>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::value::matrix4f>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::value::matrix4f>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)&vsrc,(key_type *)&ss_e);
            puVar98 = (undefined8 *)((long)paVar97->_M_elems + lVar100);
            uVar14 = puVar98[1];
            afVar5 = *(float (*) [4])((long)paVar97[2]._M_elems + lVar100);
            puVar2 = (undefined8 *)((long)paVar97[4]._M_elems + lVar100);
            uVar15 = *puVar2;
            uVar16 = puVar2[1];
            puVar2 = (undefined8 *)((long)paVar97[6]._M_elems + lVar100);
            uVar17 = *puVar2;
            uVar18 = puVar2[1];
            *(undefined8 *)pmVar84->m[0] = *puVar98;
            *(undefined8 *)(pmVar84->m[0] + 2) = uVar14;
            pmVar84->m[1] = afVar5;
            *(undefined8 *)pmVar84->m[2] = uVar15;
            *(undefined8 *)(pmVar84->m[2] + 2) = uVar16;
            *(undefined8 *)pmVar84->m[3] = uVar17;
            *(undefined8 *)(pmVar84->m[3] + 2) = uVar18;
          }
          else {
            pmVar84 = ::std::__detail::
                      _Map_base<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::value::matrix4f>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::value::matrix4f>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::value::matrix4f>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::value::matrix4f>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)&vsrc,(key_type *)&ss_e);
            bVar25 = tinyusdz::is_close(pmVar84,(matrix4f *)
                                                ((long)(vdst.
                                                  super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  _M_elems + lVar100),1.1920929e-07);
            if (!bVar25) goto LAB_00297787;
          }
          uVar90 = uVar90 + 1;
          puVar82 = (faceVertexIndices->
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          puVar91 = (faceVertexIndices->
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                    super__Vector_impl_data._M_finish;
          lVar100 = lVar100 + 0x40;
          uVar88 = local_1f8._0_8_;
        }
        _ss_e = 0x3f800000;
        aStack_198._M_allocated_capacity._0_4_ = 0;
        aStack_198._M_allocated_capacity._4_4_ = 0x3f800000;
        aStack_198._8_8_ = 0;
        _Stack_188._M_max_load_factor = 0.0;
        _Stack_188._4_4_ = 0;
        _Stack_188._M_next_resize._0_4_ = 0x3f800000;
        _Stack_188._M_next_resize._4_4_ = 0;
        uStack_178 = 0;
        uStack_174 = 0;
        uStack_170 = 0;
        uStack_16c = 0x3f800000;
        ::std::vector<tinyusdz::value::matrix4f,_std::allocator<tinyusdz::value::matrix4f>_>::
        _M_fill_assign((vector<tinyusdz::value::matrix4f,_std::allocator<tinyusdz::value::matrix4f>_>
                        *)&vidx,(ulong)((uint)uVar88 + 1),(value_type *)&ss_e);
        while (ppaVar92 = (pointer *)*ppaVar92, ppaVar92 != (pointer *)0x0) {
          lVar100 = (ulong)((pointer)(ppaVar92 + 1))->_M_elems[0] * 0x40;
          uVar14 = *(undefined8 *)((long)ppaVar92 + 0x44);
          puVar98 = (undefined8 *)((long)_vidx + 0x30 + lVar100);
          *puVar98 = *(undefined8 *)((long)ppaVar92 + 0x3c);
          puVar98[1] = uVar14;
          uVar14 = *(undefined8 *)((long)ppaVar92 + 0x34);
          puVar98 = (undefined8 *)((long)_vidx + 0x20 + lVar100);
          *puVar98 = *(undefined8 *)((long)ppaVar92 + 0x2c);
          puVar98[1] = uVar14;
          uVar14 = *(undefined8 *)((long)ppaVar92 + 0x24);
          puVar98 = (undefined8 *)((long)_vidx + 0x10 + lVar100);
          *puVar98 = *(undefined8 *)((long)ppaVar92 + 0x1c);
          puVar98[1] = uVar14;
          uVar14 = *(undefined8 *)((long)ppaVar92 + 0x14);
          *(undefined8 *)((long)_vidx + lVar100) = *(undefined8 *)((long)ppaVar92 + 0xc);
          ((undefined8 *)((long)_vidx + lVar100))[1] = uVar14;
        }
LAB_00297787:
        ::std::
        _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::value::matrix4f>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::value::matrix4f>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::value::matrix4f>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::value::matrix4f>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       *)&vsrc);
        if (uVar90 < uVar101) {
          bVar25 = false;
        }
        else {
          ::std::__cxx11::string::_M_assign((string *)dst);
          dst->elementSize = 1;
          dst->format = src->format;
          dst->variability = Vertex;
          lVar100 = (long)afStack_210 - (long)_vidx;
          sVar26 = VertexAttribute::format_size(src);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data,
                     (lVar100 >> 6) * sVar26);
          puVar12 = (dst->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          memcpy(puVar12,(void *)_vidx,
                 (long)(dst->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)puVar12);
          bVar25 = true;
        }
      }
      ::std::_Vector_base<tinyusdz::value::matrix4f,_std::allocator<tinyusdz::value::matrix4f>_>::
      ~_Vector_base((_Vector_base<tinyusdz::value::matrix4f,_std::allocator<tinyusdz::value::matrix4f>_>
                     *)&vidx);
      ::std::_Vector_base<tinyusdz::value::matrix4f,_std::allocator<tinyusdz::value::matrix4f>_>::
      ~_Vector_base((_Vector_base<tinyusdz::value::matrix4f,_std::allocator<tinyusdz::value::matrix4f>_>
                     *)&vdst);
      break;
    case Dmat2:
      vdst.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      vdst.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      vdst.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      sVar26 = VertexAttribute::vertex_count(src);
      ::std::vector<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_>::resize
                ((vector<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_> *)
                 &vdst,sVar26);
      puVar12 = (src->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start;
      memcpy(vdst.
             super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start,puVar12,
             (long)(src->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish - (long)puVar12);
      local_208 = (pointer)0x0;
      vidx = 0;
      fStack_214 = 0.0;
      afStack_210[0] = 0.0;
      afStack_210[1] = 0.0;
      puVar82 = (faceVertexIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                ._M_impl.super__Vector_impl_data._M_start;
      puVar91 = (faceVertexIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                ._M_impl.super__Vector_impl_data._M_finish;
      uVar88 = (long)puVar91 - (long)puVar82 >> 2;
      bVar25 = false;
      if (((long)vdst.
                 super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)vdst.
                 super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 5 == uVar88) && (2 < uVar88)) {
        puVar22 = &uStack_178;
        paVar102 = &aStack_198;
        aStack_198._M_allocated_capacity._0_4_ = 0;
        aStack_198._M_allocated_capacity._4_4_ = 0;
        aStack_198._8_8_ = 0;
        _Stack_188._M_max_load_factor = 1.0;
        _Stack_188._M_next_resize._0_4_ = 0;
        _Stack_188._M_next_resize._4_4_ = 0;
        uStack_178 = 0;
        uStack_174 = 0;
        lVar100 = 0;
        uVar93 = 0;
        uVar88 = 0;
        while( true ) {
          _ss_e = (uint)puVar22;
          uVar90 = (long)puVar91 - (long)puVar82 >> 2;
          if (uVar90 <= uVar88) break;
          uVar9 = puVar82[uVar88];
          vsrc.
          super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)CONCAT44(vsrc.
                                 super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start._4_4_,uVar9);
          if (uVar93 < uVar9) {
            uVar93 = uVar9;
          }
          sVar40 = ::std::
                   _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::value::matrix2d>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::value::matrix2d>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::count((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::value::matrix2d>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::value::matrix2d>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                            *)&ss_e,(key_type_conflict1 *)&vsrc);
          paVar97 = vdst.
                    super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (sVar40 == 0) {
            pmVar41 = ::std::__detail::
                      _Map_base<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::value::matrix2d>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::value::matrix2d>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::value::matrix2d>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::value::matrix2d>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)&ss_e,(key_type *)&vsrc);
            pdVar96 = (double *)((long)paVar97->_M_elems + lVar100);
            dVar104 = pdVar96[1];
            adVar4 = *(double (*) [2])((long)paVar97[2]._M_elems + lVar100);
            pmVar41->m[0][0] = *pdVar96;
            pmVar41->m[0][1] = dVar104;
            pmVar41->m[1] = adVar4;
          }
          else {
            pmVar41 = ::std::__detail::
                      _Map_base<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::value::matrix2d>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::value::matrix2d>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::value::matrix2d>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::value::matrix2d>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)&ss_e,(key_type *)&vsrc);
            bVar25 = tinyusdz::is_close(pmVar41,(matrix2d *)
                                                ((long)(vdst.
                                                  super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  _M_elems + lVar100),2.220446049250313e-16);
            if (!bVar25) goto LAB_00296bf6;
          }
          puVar22 = (undefined4 *)(ulong)_ss_e;
          uVar88 = uVar88 + 1;
          puVar82 = (local_200->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          puVar91 = (local_200->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_finish;
          lVar100 = lVar100 + 0x20;
        }
        vsrc.
        super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x3ff0000000000000;
        vsrc.
        super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        vsrc.
        super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        ::std::vector<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_>::
        _M_fill_assign((vector<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_>
                        *)&vidx,(ulong)(uVar93 + 1),(value_type *)&vsrc);
        while (paVar102 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)paVar102->_M_allocated_capacity,
              paVar102 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
          lVar100 = (ulong)(uint)(&paVar102->_M_allocated_capacity)[1] * 0x20;
          sVar23 = (&paVar102->_M_allocated_capacity)[5];
          psVar3 = (size_type *)((long)_vidx + 0x10 + lVar100);
          *psVar3 = (&paVar102->_M_allocated_capacity)[4];
          psVar3[1] = sVar23;
          sVar23 = (&paVar102->_M_allocated_capacity)[3];
          psVar3 = (size_type *)((long)_vidx + lVar100);
          *psVar3 = (&paVar102->_M_allocated_capacity)[2];
          psVar3[1] = sVar23;
        }
LAB_00296bf6:
        ::std::
        _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::value::matrix2d>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::value::matrix2d>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::value::matrix2d>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::value::matrix2d>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       *)&ss_e);
        if (uVar88 < uVar90) {
          bVar25 = false;
        }
        else {
          ::std::__cxx11::string::_M_assign((string *)dst);
          dst->elementSize = 1;
          dst->format = src->format;
          dst->variability = Vertex;
          lVar100 = (long)afStack_210 - (long)_vidx;
          sVar26 = VertexAttribute::format_size(src);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data,
                     (lVar100 >> 5) * sVar26);
          puVar12 = (dst->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          memcpy(puVar12,(void *)_vidx,
                 (long)(dst->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)puVar12);
          bVar25 = true;
        }
      }
      ::std::_Vector_base<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_>::
      ~_Vector_base((_Vector_base<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_>
                     *)&vidx);
      ::std::_Vector_base<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_>::
      ~_Vector_base((_Vector_base<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_>
                     *)&vdst);
      break;
    case Dmat3:
      vdst.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      vdst.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      vdst.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      sVar26 = VertexAttribute::vertex_count(src);
      ::std::vector<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_>::resize
                ((vector<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_> *)
                 &vdst,sVar26);
      puVar12 = (src->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start;
      memcpy(vdst.
             super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start,puVar12,
             (long)(src->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish - (long)puVar12);
      local_208 = (pointer)0x0;
      vidx = 0;
      fStack_214 = 0.0;
      afStack_210[0] = 0.0;
      afStack_210[1] = 0.0;
      puVar82 = (faceVertexIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                ._M_impl.super__Vector_impl_data._M_start;
      puVar91 = (faceVertexIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                ._M_impl.super__Vector_impl_data._M_finish;
      uVar88 = (long)puVar91 - (long)puVar82 >> 2;
      bVar25 = false;
      if ((((long)vdst.
                  super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
           (long)vdst.
                 super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start) / 0x48 == uVar88) && (2 < uVar88)) {
        vsrc.
        super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
        ._M_impl.super__Vector_impl_data._M_start = aaStack_1b8;
        vsrc.
        super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x1;
        ppaVar92 = &vsrc.
                    super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
        vsrc.
        super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        aaStack_1b8[0]._M_elems[0] = 0;
        aaStack_1b8[0]._M_elems[1] = 0;
        lVar100 = 0;
        uVar93 = 0;
        uVar88 = 0;
        while( true ) {
          uVar90 = (long)puVar91 - (long)puVar82 >> 2;
          if (uVar90 <= uVar88) break;
          _ss_e = puVar82[uVar88];
          if (uVar93 < _ss_e) {
            uVar93 = _ss_e;
          }
          sVar50 = ::std::
                   _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::value::matrix3d>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::value::matrix3d>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::count((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::value::matrix3d>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::value::matrix3d>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                            *)&vsrc,(key_type_conflict1 *)&ss_e);
          if (sVar50 == 0) {
            puVar87 = (vdst.
                       super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->_M_elems;
            pmVar51 = ::std::__detail::
                      _Map_base<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::value::matrix3d>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::value::matrix3d>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::value::matrix3d>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::value::matrix3d>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)&vsrc,(key_type *)&ss_e);
            pdVar96 = (double *)((long)puVar87 + lVar100);
            for (lVar89 = 9; lVar89 != 0; lVar89 = lVar89 + -1) {
              pmVar51->m[0][0] = *pdVar96;
              pdVar96 = pdVar96 + (ulong)bVar103 * -2 + 1;
              pmVar51 = (mapped_type *)((long)pmVar51 + ((ulong)bVar103 * -2 + 1) * 8);
            }
          }
          else {
            pmVar51 = ::std::__detail::
                      _Map_base<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::value::matrix3d>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::value::matrix3d>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::value::matrix3d>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::value::matrix3d>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)&vsrc,(key_type *)&ss_e);
            bVar25 = tinyusdz::is_close(pmVar51,(matrix3d *)
                                                ((long)(vdst.
                                                  super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  _M_elems + lVar100),2.220446049250313e-16);
            if (!bVar25) goto LAB_0029631d;
          }
          uVar88 = uVar88 + 1;
          puVar82 = (local_200->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          puVar91 = (local_200->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_finish;
          lVar100 = lVar100 + 0x48;
        }
        _ss_e = 0;
        aStack_198._8_8_ = 0;
        aStack_198._M_allocated_capacity._0_4_ = 0;
        aStack_198._M_allocated_capacity._4_4_ = 0;
        _Stack_188._M_max_load_factor = 0.0;
        _Stack_188._4_4_ = 0x3ff00000;
        _Stack_188._M_next_resize._0_4_ = 0;
        _Stack_188._M_next_resize._4_4_ = 0;
        uStack_178 = 0;
        uStack_174 = 0;
        uStack_170 = 0;
        uStack_16c = 0;
        local_168 = 0x3ff0000000000000;
        ::std::vector<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_>::
        _M_fill_assign((vector<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_>
                        *)&vidx,(ulong)(uVar93 + 1),(value_type *)&ss_e);
        while (ppaVar92 = (pointer *)*ppaVar92, ppaVar92 != (pointer *)0x0) {
          paVar97 = (pointer)(ppaVar92 + 2);
          puVar98 = (undefined8 *)
                    ((ulong)((pointer)(ppaVar92 + 1))->_M_elems[0] * 0x48 + (long)_vidx);
          for (lVar100 = 9; lVar100 != 0; lVar100 = lVar100 + -1) {
            *puVar98 = *(undefined8 *)paVar97->_M_elems;
            paVar97 = paVar97 + (ulong)bVar103 * -2 + 1;
            puVar98 = puVar98 + (ulong)bVar103 * -2 + 1;
          }
        }
LAB_0029631d:
        ::std::
        _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::value::matrix3d>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::value::matrix3d>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::value::matrix3d>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::value::matrix3d>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       *)&vsrc);
        if (uVar88 < uVar90) {
          bVar25 = false;
        }
        else {
          ::std::__cxx11::string::_M_assign((string *)dst);
          dst->elementSize = 1;
          dst->format = src->format;
          dst->variability = Vertex;
          lVar100 = (long)afStack_210 - (long)_vidx;
          sVar26 = VertexAttribute::format_size(src);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data,
                     (lVar100 / 0x48) * sVar26);
          puVar12 = (dst->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          memcpy(puVar12,(void *)_vidx,
                 (long)(dst->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)puVar12);
          bVar25 = true;
        }
      }
      ::std::_Vector_base<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_>::
      ~_Vector_base((_Vector_base<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_>
                     *)&vidx);
      ::std::_Vector_base<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_>::
      ~_Vector_base((_Vector_base<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_>
                     *)&vdst);
      break;
    case Dmat4:
      vdst.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      vdst.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      vdst.
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      sVar26 = VertexAttribute::vertex_count(src);
      ::std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>::resize
                ((vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_> *)
                 &vdst,sVar26);
      puVar12 = (src->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start;
      memcpy(vdst.
             super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start,puVar12,
             (long)(src->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish - (long)puVar12);
      local_208 = (pointer)0x0;
      vidx = 0;
      fStack_214 = 0.0;
      afStack_210[0] = 0.0;
      afStack_210[1] = 0.0;
      puVar82 = (faceVertexIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                ._M_impl.super__Vector_impl_data._M_start;
      puVar91 = (faceVertexIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                ._M_impl.super__Vector_impl_data._M_finish;
      uVar88 = (long)puVar91 - (long)puVar82 >> 2;
      bVar25 = false;
      if (((long)vdst.
                 super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)vdst.
                 super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 7 == uVar88) && (2 < uVar88)) {
        vsrc.
        super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
        ._M_impl.super__Vector_impl_data._M_start = aaStack_1b8;
        vsrc.
        super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x1;
        ppaVar92 = &vsrc.
                    super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
        vsrc.
        super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        aaStack_1b8[0]._M_elems[0] = 0;
        aaStack_1b8[0]._M_elems[1] = 0;
        lVar100 = 0;
        uVar90 = 0;
        uVar88 = 0;
        while( true ) {
          uVar101 = (long)puVar91 - (long)puVar82 >> 2;
          if (uVar101 <= uVar90) break;
          _ss_e = puVar82[uVar90];
          uVar95 = uVar88 & 0xffffffff;
          if ((uint)uVar88 < _ss_e) {
            uVar95 = (ulong)_ss_e;
          }
          local_1f8._0_8_ = uVar95;
          sVar66 = ::std::
                   _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::value::matrix4d>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::value::matrix4d>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::count((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::value::matrix4d>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::value::matrix4d>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                            *)&vsrc,(key_type_conflict1 *)&ss_e);
          if (sVar66 == 0) {
            puVar87 = (vdst.
                       super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->_M_elems;
            pmVar67 = ::std::__detail::
                      _Map_base<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::value::matrix4d>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::value::matrix4d>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::value::matrix4d>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::value::matrix4d>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)&vsrc,(key_type *)&ss_e);
            pdVar96 = (double *)((long)puVar87 + lVar100);
            for (lVar89 = 0x10; lVar89 != 0; lVar89 = lVar89 + -1) {
              pmVar67->m[0][0] = *pdVar96;
              pdVar96 = pdVar96 + (ulong)bVar103 * -2 + 1;
              pmVar67 = (mapped_type *)((long)pmVar67 + ((ulong)bVar103 * -2 + 1) * 8);
            }
          }
          else {
            pmVar67 = ::std::__detail::
                      _Map_base<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::value::matrix4d>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::value::matrix4d>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::value::matrix4d>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::value::matrix4d>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)&vsrc,(key_type *)&ss_e);
            bVar25 = tinyusdz::is_close(pmVar67,(matrix4d *)
                                                ((long)(vdst.
                                                  super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  _M_elems + lVar100),2.220446049250313e-16);
            if (!bVar25) goto LAB_00297351;
          }
          uVar90 = uVar90 + 1;
          puVar82 = (faceVertexIndices->
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          puVar91 = (faceVertexIndices->
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                    super__Vector_impl_data._M_finish;
          lVar100 = lVar100 + 0x80;
          uVar88 = local_1f8._0_8_;
        }
        _ss_e = 0;
        aStack_198._M_allocated_capacity._0_4_ = 0;
        aStack_198._M_allocated_capacity._4_4_ = 0;
        aStack_198._8_8_ = 0;
        _Stack_188._M_max_load_factor = 0.0;
        _Stack_188._4_4_ = 0;
        _Stack_188._M_next_resize._0_4_ = 0;
        _Stack_188._M_next_resize._4_4_ = 0x3ff00000;
        uStack_178 = 0;
        uStack_174 = 0;
        uStack_170 = 0;
        uStack_16c = 0;
        local_168 = 0;
        uStack_160 = 0;
        local_158 = 0x3ff0000000000000;
        local_150 = 0;
        uStack_148 = 0;
        local_140 = 0;
        uStack_138 = 0;
        local_130 = 0x3ff0000000000000;
        ::std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>::
        _M_fill_assign((vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                        *)&vidx,(ulong)((uint)uVar88 + 1),(value_type *)&ss_e);
        while (ppaVar92 = (pointer *)*ppaVar92, ppaVar92 != (pointer *)0x0) {
          paVar97 = (pointer)(ppaVar92 + 2);
          puVar98 = (undefined8 *)
                    ((ulong)((pointer)(ppaVar92 + 1))->_M_elems[0] * 0x80 + (long)_vidx);
          for (lVar100 = 0x10; lVar100 != 0; lVar100 = lVar100 + -1) {
            *puVar98 = *(undefined8 *)paVar97->_M_elems;
            paVar97 = paVar97 + (ulong)bVar103 * -2 + 1;
            puVar98 = puVar98 + (ulong)bVar103 * -2 + 1;
          }
        }
LAB_00297351:
        ::std::
        _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::value::matrix4d>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::value::matrix4d>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::value::matrix4d>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::value::matrix4d>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       *)&vsrc);
        if (uVar90 < uVar101) {
          bVar25 = false;
        }
        else {
          ::std::__cxx11::string::_M_assign((string *)dst);
          dst->elementSize = 1;
          dst->format = src->format;
          dst->variability = Vertex;
          lVar100 = (long)afStack_210 - (long)_vidx;
          sVar26 = VertexAttribute::format_size(src);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data,
                     (lVar100 >> 7) * sVar26);
          puVar12 = (dst->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          memcpy(puVar12,(void *)_vidx,
                 (long)(dst->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)puVar12);
          bVar25 = true;
        }
      }
      ::std::_Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>::
      ~_Vector_base((_Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                     *)&vidx);
      ::std::_Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>::
      ~_Vector_base((_Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                     *)&vdst);
    }
  }
  return bVar25;
}

Assistant:

static bool TryConvertFacevaryingToVertex(
    const VertexAttribute &src, VertexAttribute *dst,
    const std::vector<uint32_t> &faceVertexIndices, std::string *err,
    const float eps) {
  DCOUT("TryConvertFacevaryingToVertex");
  if (!dst) {
    PUSH_ERROR_AND_RETURN("Output `dst` is nullptr.");
  }

  if (!src.is_facevarying()) {
    PUSH_ERROR_AND_RETURN("Input must be 'facevarying' attribute");
  }

  if (src.element_size() != 1) {
    PUSH_ERROR_AND_RETURN("Input's element_size must be 1.");
  }

  if ((src.stride != 0) && (src.stride_bytes() != src.format_size())) {
    PUSH_ERROR_AND_RETURN(
        "Input attribute must be tightly packed. stride_bytes = "
        << src.stride_bytes() << ", format_size = " << src.format_size());
  }

#define CONVERT_FUN_INT(__fmt, __ty)                                      \
  if (src.format == __fmt) {                                              \
    std::vector<__ty> vsrc;                                               \
    vsrc.resize(src.vertex_count());                                      \
    memcpy(vsrc.data(), src.get_data().data(), src.get_data().size());    \
    std::vector<__ty> vdst;                                               \
    bool ret = TryConvertFacevaryingToVertexInt<__ty>(vsrc, &vdst,        \
                                                      faceVertexIndices); \
    if (!ret) {                                                           \
      return false;                                                       \
    }                                                                     \
    dst->name = src.name;                                                 \
    dst->elementSize = 1;                                                 \
    dst->format = src.format;                                             \
    dst->variability = VertexVariability::Vertex;                         \
    dst->data.resize(vdst.size() * src.format_size());                    \
    memcpy(dst->data.data(), vdst.data(), dst->data.size());              \
    return true;                                                          \
  } else

#define CONVERT_FUN_FLOAT(__fmt, __ty, __epsty)                        \
  if (src.format == __fmt) {                                           \
    std::vector<__ty> vsrc;                                            \
    vsrc.resize(src.vertex_count());                                   \
    memcpy(vsrc.data(), src.get_data().data(), src.get_data().size()); \
    std::vector<__ty> vdst;                                            \
    bool ret = TryConvertFacevaryingToVertexFloat<__ty, __epsty>(      \
        vsrc, &vdst, faceVertexIndices, __epsty(eps));                 \
    if (!ret) {                                                        \
      return false;                                                    \
    }                                                                  \
    dst->name = src.name;                                                 \
    dst->elementSize = 1;                                              \
    dst->format = src.format;                                          \
    dst->variability = VertexVariability::Vertex;                      \
    dst->data.resize(vdst.size() * src.format_size());                 \
    memcpy(dst->data.data(), vdst.data(), dst->data.size());           \
    return true;                                                       \
  } else

#define CONVERT_FUN_MAT(__fmt, __ty)                                      \
  if (src.format == __fmt) {                                              \
    std::vector<__ty> vsrc;                                               \
    vsrc.resize(src.vertex_count());                                      \
    memcpy(vsrc.data(), src.get_data().data(), src.get_data().size());    \
    std::vector<__ty> vdst;                                               \
    bool ret = TryConvertFacevaryingToVertexMat<__ty>(vsrc, &vdst,        \
                                                      faceVertexIndices); \
    if (!ret) {                                                           \
      return false;                                                       \
    }                                                                     \
    dst->name = src.name;                                                 \
    dst->elementSize = 1;                                                 \
    dst->format = src.format;                                             \
    dst->variability = VertexVariability::Vertex;                         \
    dst->data.resize(vdst.size() * src.format_size());                    \
    memcpy(dst->data.data(), vdst.data(), dst->data.size());              \
    return true;                                                          \
  } else

  // NOTE: VertexAttributeFormat::Bool is preserved
  CONVERT_FUN_INT(VertexAttributeFormat::Bool, uint8_t)
  CONVERT_FUN_FLOAT(VertexAttributeFormat::Float, float, float)
  CONVERT_FUN_FLOAT(VertexAttributeFormat::Vec2, value::float2, float)
  CONVERT_FUN_FLOAT(VertexAttributeFormat::Vec3, value::float3, float)
  CONVERT_FUN_FLOAT(VertexAttributeFormat::Vec4, value::float4, float)
  CONVERT_FUN_INT(VertexAttributeFormat::Char, signed char)
  // CONVERT_FUN(VertexAttributeFormat::Char2, value::char2)
  // CONVERT_FUN(VertexAttributeFormat::Char3, value::char3)
  // CONVERT_FUN(VertexAttributeFormat::Char4,    // int8x4
  CONVERT_FUN_INT(VertexAttributeFormat::Byte, uint8_t)
  // CONVERT_FUN(VertexAttributeFormat::Byte2,    // uint8x2
  // CONVERT_FUN(VertexAttributeFormat::Byte3,    // uint8x3
  // CONVERT_FUN(VertexAttributeFormat::Byte4,    // uint8x4
  CONVERT_FUN_INT(VertexAttributeFormat::Short, int16_t)
  // CONVERT_FUN(VertexAttributeFormat::Short2, value::short2)
  // CONVERT_FUN(VertexAttributeFormat::Short3, value::short3)
  // CONVERT_FUN(VertexAttributeFormat::Short4, value::short4)
  CONVERT_FUN_INT(VertexAttributeFormat::Ushort, uint16_t)
  // CONVERT_FUN(VertexAttributeFormat::Ushort2, uint16_t)
  // CONVERT_FUN(VertexAttributeFormat::Ushort3, uint16_t)
  // CONVERT_FUN(VertexAttributeFormat::Ushort4, uint16_t)
  CONVERT_FUN_FLOAT(VertexAttributeFormat::Half, value::half, float)
  CONVERT_FUN_FLOAT(VertexAttributeFormat::Half2, value::half2, float)
  CONVERT_FUN_FLOAT(VertexAttributeFormat::Half3, value::half3, float)
  CONVERT_FUN_FLOAT(VertexAttributeFormat::Half4, value::half4, float)
  CONVERT_FUN_INT(VertexAttributeFormat::Int, int)
  CONVERT_FUN_INT(VertexAttributeFormat::Ivec2, value::int2)
  CONVERT_FUN_INT(VertexAttributeFormat::Ivec3, value::int3)
  CONVERT_FUN_INT(VertexAttributeFormat::Ivec4, value::int4)
  CONVERT_FUN_INT(VertexAttributeFormat::Uint, uint32_t)
  CONVERT_FUN_INT(VertexAttributeFormat::Uvec2, value::uint2)
  CONVERT_FUN_INT(VertexAttributeFormat::Uvec3, value::uint3)
  CONVERT_FUN_INT(VertexAttributeFormat::Uvec4, value::uint4)
  // NOTE: Use float precision eps is upcasted to double precision.
  CONVERT_FUN_FLOAT(VertexAttributeFormat::Double, double, double)
  CONVERT_FUN_FLOAT(VertexAttributeFormat::Dvec2, value::double2, double)
  CONVERT_FUN_FLOAT(VertexAttributeFormat::Dvec3, value::double3, double)
  CONVERT_FUN_FLOAT(VertexAttributeFormat::Dvec4, value::double4, double)
  CONVERT_FUN_MAT(VertexAttributeFormat::Mat2, value::matrix2f)
  CONVERT_FUN_MAT(VertexAttributeFormat::Mat3, value::matrix3f)
  CONVERT_FUN_MAT(VertexAttributeFormat::Mat4, value::matrix4f)
  CONVERT_FUN_MAT(VertexAttributeFormat::Dmat2, value::matrix2d)
  CONVERT_FUN_MAT(VertexAttributeFormat::Dmat3, value::matrix3d)
  CONVERT_FUN_MAT(VertexAttributeFormat::Dmat4, value::matrix4d) {
    if (err) {
      (*err) +=
          fmt::format("Unsupported/Unimplemented VertexAttributeFormat: {}",
                      to_string(src.format));
    }
  }

#undef CONVERT_FUN_INT
#undef CONVERT_FUN_FLOAT
#undef CONVERT_FUN_MAT

  return false;
}